

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  long lVar57;
  ulong uVar58;
  byte bVar59;
  byte bVar60;
  long lVar61;
  bool bVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar130;
  uint uVar131;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar137;
  undefined4 uVar138;
  float fVar156;
  float fVar157;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar148 [16];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar181;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar182 [16];
  float fVar199;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar219;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  vint4 ai;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  undefined1 auVar230 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [64];
  vint4 ai_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  vint4 ai_2;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar240;
  float fVar245;
  float fVar246;
  undefined1 auVar241 [16];
  float fVar247;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar254;
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  float fVar262;
  float fVar263;
  undefined1 auVar261 [16];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8ec;
  int local_8d4;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  RTCFilterFunctionNArguments local_758;
  uint local_728;
  uint local_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  float local_618;
  float local_614;
  undefined4 local_610;
  uint local_60c;
  uint local_608;
  uint local_604;
  uint local_600;
  Primitive *local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  ulong local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [16];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar63 = (ulong)(byte)prim[1];
  lVar57 = uVar63 * 0x25;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar57 + 0x12)));
  auVar66 = vsubps_avx512vl((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                            *(undefined1 (*) [16])(prim + lVar57 + 6));
  fVar200 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar57 + 0x16)) *
            *(float *)(prim + lVar57 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar19 = vpmovsxwd_avx(auVar79);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar139 = vpmovsxwd_avx(auVar85);
  auVar67 = vpbroadcastd_avx512vl();
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar163 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar68 = vpmovsxwd_avx512vl(auVar80);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar63 * 0x16 + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar66 = vmulps_avx512vl(auVar65,auVar66);
  auVar65 = vmulps_avx512vl(auVar65,(undefined1  [16])(ray->super_RayK<1>).dir.field_0);
  auVar69 = vcvtdq2ps_avx512vl(auVar75);
  auVar70 = vcvtdq2ps_avx512vl(auVar70);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar85 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  auVar74 = vbroadcastss_avx512vl(auVar65);
  auVar75 = vshufps_avx512vl(auVar65,auVar65,0x55);
  auVar76 = vshufps_avx512vl(auVar65,auVar65,0xaa);
  auVar77 = vmulps_avx512vl(auVar76,auVar71);
  auVar162._0_4_ = auVar76._0_4_ * auVar79._0_4_;
  auVar162._4_4_ = auVar76._4_4_ * auVar79._4_4_;
  auVar162._8_4_ = auVar76._8_4_ * auVar79._8_4_;
  auVar162._12_4_ = auVar76._12_4_ * auVar79._12_4_;
  auVar65._0_4_ = auVar80._0_4_ * auVar76._0_4_;
  auVar65._4_4_ = auVar80._4_4_ * auVar76._4_4_;
  auVar65._8_4_ = auVar80._8_4_ * auVar76._8_4_;
  auVar65._12_4_ = auVar80._12_4_ * auVar76._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar70);
  auVar77 = vfmadd231ps_avx512vl(auVar162,auVar75,auVar73);
  auVar75 = vfmadd231ps_fma(auVar65,auVar81,auVar75);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar69);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar72);
  auVar75 = vfmadd231ps_fma(auVar75,auVar85,auVar74);
  auVar74 = vbroadcastss_avx512vl(auVar66);
  auVar78 = vshufps_avx512vl(auVar66,auVar66,0x55);
  auVar65 = vshufps_avx512vl(auVar66,auVar66,0xaa);
  auVar71 = vmulps_avx512vl(auVar65,auVar71);
  auVar79 = vmulps_avx512vl(auVar65,auVar79);
  auVar80 = vmulps_avx512vl(auVar65,auVar80);
  auVar70 = vfmadd231ps_avx512vl(auVar71,auVar78,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar81);
  auVar66 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar72);
  auVar65 = vfmadd231ps_fma(auVar81,auVar74,auVar85);
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar255,auVar76);
  auVar250._8_4_ = 0x219392ef;
  auVar250._0_8_ = 0x219392ef219392ef;
  auVar250._12_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar79,auVar250,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar82._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._12_4_;
  auVar79 = vandps_avx(auVar255,auVar77);
  uVar58 = vcmpps_avx512vl(auVar79,auVar250,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar83._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._12_4_;
  auVar79 = vandps_avx(auVar255,auVar75);
  uVar58 = vcmpps_avx512vl(auVar79,auVar250,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar84._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = 0x3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar82,auVar85,auVar251);
  auVar81 = vfmadd132ps_fma(auVar79,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar85,auVar251);
  auVar80 = vfmadd132ps_fma(auVar79,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar79 = vfnmadd213ps_fma(auVar84,auVar85,auVar251);
  auVar76 = vfmadd132ps_fma(auVar79,auVar85,auVar85);
  auVar225._4_4_ = fVar200;
  auVar225._0_4_ = fVar200;
  auVar225._8_4_ = fVar200;
  auVar225._12_4_ = fVar200;
  auVar79 = vcvtdq2ps_avx(auVar19);
  auVar85 = vcvtdq2ps_avx(auVar139);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar77 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar163);
  auVar85 = vcvtdq2ps_avx512vl(auVar68);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar78 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar87);
  auVar85 = vcvtdq2ps_avx(auVar86);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar87 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar79 = vpmovsxwd_avx(auVar75);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar70);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar86 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar71);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 0x21 + 6);
  auVar85 = vpmovsxwd_avx(auVar72);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar75 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar260 = ZEXT1664(auVar75);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar74);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar79);
  auVar85 = vfmadd213ps_fma(auVar85,auVar225,auVar79);
  auVar79 = vsubps_avx512vl(auVar77,auVar66);
  auVar68._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar68._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar68._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar68._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx512vl(auVar78,auVar66);
  auVar66._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar66._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar66._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar66._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar87,auVar69);
  auVar233._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar233._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar233._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar233._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar86,auVar69);
  auVar163._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar163._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar163._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar163._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar65);
  auVar69._0_4_ = auVar76._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar76._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar76._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar76._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar85,auVar65);
  auVar139._0_4_ = auVar76._0_4_ * auVar79._0_4_;
  auVar139._4_4_ = auVar76._4_4_ * auVar79._4_4_;
  auVar139._8_4_ = auVar76._8_4_ * auVar79._8_4_;
  auVar139._12_4_ = auVar76._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar68,auVar66);
  auVar85 = vpminsd_avx(auVar233,auVar163);
  auVar79 = vmaxps_avx(auVar79,auVar85);
  auVar85 = vpminsd_avx(auVar69,auVar139);
  uVar138 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar76._4_4_ = uVar138;
  auVar76._0_4_ = uVar138;
  auVar76._8_4_ = uVar138;
  auVar76._12_4_ = uVar138;
  auVar85 = vmaxps_avx512vl(auVar85,auVar76);
  auVar79 = vmaxps_avx(auVar79,auVar85);
  auVar77._8_4_ = 0x3f7ffffa;
  auVar77._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar77._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar79,auVar77);
  auVar79 = vpmaxsd_avx(auVar68,auVar66);
  auVar85 = vpmaxsd_avx(auVar233,auVar163);
  auVar79 = vminps_avx(auVar79,auVar85);
  auVar85 = vpmaxsd_avx(auVar69,auVar139);
  fVar200 = (ray->super_RayK<1>).tfar;
  auVar78._4_4_ = fVar200;
  auVar78._0_4_ = fVar200;
  auVar78._8_4_ = fVar200;
  auVar78._12_4_ = fVar200;
  auVar85 = vminps_avx512vl(auVar85,auVar78);
  auVar79 = vminps_avx(auVar79,auVar85);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar19);
  uVar20 = vcmpps_avx512vl(local_380,auVar79,2);
  uVar23 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  uVar58 = (ulong)((byte)uVar20 & 0xf & (byte)uVar23);
  local_5e8 = prim;
LAB_018c9656:
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  auVar257 = ZEXT3264(auVar91);
  if (uVar58 == 0) {
    return;
  }
  local_4a8 = uVar58;
  lVar57 = 0;
  for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  local_8d0 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8c8 = (ulong)*(uint *)(prim + lVar57 * 4 + 6);
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar57 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar200 = (pGVar4->time_range).lower;
  fVar200 = pGVar4->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar200) /
            ((pGVar4->time_range).upper - fVar200));
  auVar79 = vroundss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),9);
  auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
  fVar200 = fVar200 - auVar79._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar79._0_4_ * 0x38;
  lVar57 = *(long *)(_Var5 + 0x10 + lVar61);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar61);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar6 + uVar58 * lVar7);
  auVar182._0_4_ = fVar200 * *pfVar1;
  auVar182._4_4_ = fVar200 * pfVar1[1];
  auVar182._8_4_ = fVar200 * pfVar1[2];
  auVar182._12_4_ = fVar200 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar58 + 1) * lVar7);
  auVar201._0_4_ = fVar200 * *pfVar1;
  auVar201._4_4_ = fVar200 * pfVar1[1];
  auVar201._8_4_ = fVar200 * pfVar1[2];
  auVar201._12_4_ = fVar200 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar58 + 2) * lVar7);
  auVar220._0_4_ = fVar200 * *pfVar1;
  auVar220._4_4_ = fVar200 * pfVar1[1];
  auVar220._8_4_ = fVar200 * pfVar1[2];
  auVar220._12_4_ = fVar200 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar58 + 3));
  auVar164._0_4_ = fVar200 * *pfVar1;
  auVar164._4_4_ = fVar200 * pfVar1[1];
  auVar164._8_4_ = fVar200 * pfVar1[2];
  auVar164._12_4_ = fVar200 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar61);
  fVar200 = 1.0 - fVar200;
  auVar140._4_4_ = fVar200;
  auVar140._0_4_ = fVar200;
  auVar140._8_4_ = fVar200;
  auVar140._12_4_ = fVar200;
  auVar81 = vfmadd231ps_fma(auVar182,auVar140,*(undefined1 (*) [16])(lVar6 + lVar57 * uVar58));
  auVar80 = vfmadd231ps_fma(auVar201,auVar140,*(undefined1 (*) [16])(lVar6 + lVar57 * (uVar58 + 1)))
  ;
  auVar87 = vfmadd231ps_fma(auVar220,auVar140,*(undefined1 (*) [16])(lVar6 + lVar57 * (uVar58 + 2)))
  ;
  auVar86 = vfmadd231ps_fma(auVar164,auVar140,*(undefined1 (*) [16])(lVar6 + lVar57 * (uVar58 + 3)))
  ;
  auVar226._0_4_ = auVar81._0_4_ + auVar80._0_4_ + auVar87._0_4_ + auVar86._0_4_;
  auVar226._4_4_ = auVar81._4_4_ + auVar80._4_4_ + auVar87._4_4_ + auVar86._4_4_;
  auVar226._8_4_ = auVar81._8_4_ + auVar80._8_4_ + auVar87._8_4_ + auVar86._8_4_;
  auVar226._12_4_ = auVar81._12_4_ + auVar80._12_4_ + auVar87._12_4_ + auVar86._12_4_;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar67._8_4_ = 0x3e800000;
  auVar67._0_8_ = 0x3e8000003e800000;
  auVar67._12_4_ = 0x3e800000;
  auVar79 = vmulps_avx512vl(auVar226,auVar67);
  auVar79 = vsubps_avx(auVar79,(undefined1  [16])aVar2);
  auVar79 = vdpps_avx(auVar79,(undefined1  [16])aVar3,0x7f);
  auVar85 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar70 = ZEXT816(0) << 0x40;
  auVar253 = ZEXT1664(auVar70);
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = auVar85._0_4_;
  auVar75 = vrcp14ss_avx512f(auVar70,auVar241);
  auVar85 = vfnmadd213ss_fma(auVar75,auVar85,ZEXT416(0x40000000));
  fVar200 = auVar79._0_4_ * auVar75._0_4_ * auVar85._0_4_;
  local_500 = ZEXT416((uint)fVar200);
  auVar227._4_4_ = fVar200;
  auVar227._0_4_ = fVar200;
  auVar227._8_4_ = fVar200;
  auVar227._12_4_ = fVar200;
  fStack_3d0 = fVar200;
  _local_3e0 = auVar227;
  fStack_3cc = fVar200;
  fStack_3c8 = fVar200;
  fStack_3c4 = fVar200;
  auVar79 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar227);
  auVar79 = vblendps_avx(auVar79,auVar70,8);
  auVar85 = vsubps_avx(auVar81,auVar79);
  auVar81 = vsubps_avx(auVar87,auVar79);
  uVar138 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_340._4_4_ = uVar138;
  local_340._0_4_ = uVar138;
  local_340._8_4_ = uVar138;
  local_340._12_4_ = uVar138;
  local_340._16_4_ = uVar138;
  local_340._20_4_ = uVar138;
  local_340._24_4_ = uVar138;
  local_340._28_4_ = uVar138;
  auVar248 = ZEXT3264(local_340);
  local_6c0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar272 = ZEXT3264(local_6c0);
  local_420 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  auVar80 = vsubps_avx(auVar80,auVar79);
  auVar239 = ZEXT1664(auVar80);
  auVar79 = vsubps_avx(auVar86,auVar79);
  auVar231 = ZEXT1664(auVar79);
  local_7c0 = vbroadcastss_avx512vl(auVar85);
  auVar270 = ZEXT3264(local_7c0);
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  local_560 = ZEXT1632(auVar85);
  local_7e0 = vpermps_avx512vl(auVar88,local_560);
  auVar264 = ZEXT3264(local_7e0);
  auVar89._8_4_ = 2;
  auVar89._0_8_ = 0x200000002;
  auVar89._12_4_ = 2;
  auVar89._16_4_ = 2;
  auVar89._20_4_ = 2;
  auVar89._24_4_ = 2;
  auVar89._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar89,local_560);
  auVar265 = ZEXT3264(local_800);
  auVar92._8_4_ = 3;
  auVar92._0_8_ = 0x300000003;
  auVar92._12_4_ = 3;
  auVar92._16_4_ = 3;
  auVar92._20_4_ = 3;
  auVar92._24_4_ = 3;
  auVar92._28_4_ = 3;
  auVar244 = ZEXT3264(auVar92);
  local_820 = vpermps_avx512vl(auVar92,local_560);
  auVar266 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar80);
  auVar267 = ZEXT3264(local_840);
  local_5a0 = ZEXT1632(auVar80);
  local_860 = vpermps_avx512vl(auVar88,local_5a0);
  auVar268 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar89,local_5a0);
  auVar269 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar92,local_5a0);
  auVar271 = ZEXT3264(local_8a0);
  local_6e0 = vbroadcastss_avx512vl(auVar81);
  auVar273 = ZEXT3264(local_6e0);
  local_580 = ZEXT1632(auVar81);
  local_700 = vpermps_avx512vl(auVar88,local_580);
  auVar274 = ZEXT3264(local_700);
  local_720 = vpermps_avx512vl(auVar89,local_580);
  auVar275 = ZEXT3264(local_720);
  local_7a0 = vpermps_avx512vl(auVar92,local_580);
  auVar276 = ZEXT3264(local_7a0);
  local_1e0 = auVar79._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  _local_5c0 = ZEXT1632(auVar79);
  _local_200 = vpermps_avx2(auVar88,_local_5c0);
  local_260 = vpermps_avx512vl(auVar89,_local_5c0);
  local_280 = vpermps_avx2(auVar92,_local_5c0);
  auVar88 = vpermps_avx2(auVar89,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  auVar88 = vfmadd231ps_avx512vl(auVar88,local_6c0,local_6c0);
  auVar79 = vfmadd231ps_fma(auVar88,local_340,local_340);
  local_220 = ZEXT1632(auVar79);
  local_240 = vandps_avx(auVar91,ZEXT1632(auVar79));
  uVar58 = 0;
  local_8ec = 1;
  local_370 = ZEXT816(0x3f80000000000000);
  do {
    auVar79 = vmovshdup_avx(local_370);
    auVar79 = vsubps_avx(auVar79,local_370);
    auVar141._0_4_ = auVar79._0_4_;
    fVar18 = auVar141._0_4_ * 0.04761905;
    uVar138 = local_370._0_4_;
    local_640._4_4_ = uVar138;
    local_640._0_4_ = uVar138;
    local_640._8_4_ = uVar138;
    local_640._12_4_ = uVar138;
    local_640._16_4_ = uVar138;
    local_640._20_4_ = uVar138;
    local_640._24_4_ = uVar138;
    local_640._28_4_ = uVar138;
    auVar141._4_4_ = auVar141._0_4_;
    auVar141._8_4_ = auVar141._0_4_;
    auVar141._12_4_ = auVar141._0_4_;
    local_6a0._16_4_ = auVar141._0_4_;
    local_6a0._0_16_ = auVar141;
    local_6a0._20_4_ = auVar141._0_4_;
    local_6a0._24_4_ = auVar141._0_4_;
    local_6a0._28_4_ = auVar141._0_4_;
    auVar79 = vfmadd231ps_fma(local_640,local_6a0,_DAT_01f7b040);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar89 = vsubps_avx512vl(auVar88,ZEXT1632(auVar79));
    fVar240 = auVar89._0_4_;
    fVar246 = auVar89._4_4_;
    fVar218 = auVar89._8_4_;
    fVar262 = auVar89._12_4_;
    fVar181 = auVar89._16_4_;
    fVar16 = auVar89._20_4_;
    fVar17 = auVar89._24_4_;
    fVar137 = fVar240 * fVar240 * fVar240;
    fVar156 = fVar246 * fVar246 * fVar246;
    auVar93._4_4_ = fVar156;
    auVar93._0_4_ = fVar137;
    fVar157 = fVar218 * fVar218 * fVar218;
    auVar93._8_4_ = fVar157;
    fVar158 = fVar262 * fVar262 * fVar262;
    auVar93._12_4_ = fVar158;
    fVar159 = fVar181 * fVar181 * fVar181;
    auVar93._16_4_ = fVar159;
    fVar160 = fVar16 * fVar16 * fVar16;
    auVar93._20_4_ = fVar160;
    fVar161 = fVar17 * fVar17 * fVar17;
    auVar93._24_4_ = fVar161;
    auVar93._28_4_ = auVar141._0_4_;
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar91 = vmulps_avx512vl(auVar93,auVar90);
    fVar245 = auVar79._0_4_;
    fVar247 = auVar79._4_4_;
    fVar219 = auVar79._8_4_;
    fVar263 = auVar79._12_4_;
    fVar180 = fVar245 * fVar245 * fVar245;
    fVar197 = fVar247 * fVar247 * fVar247;
    fVar198 = fVar219 * fVar219 * fVar219;
    fVar199 = fVar263 * fVar263 * fVar263;
    auVar249._0_4_ = fVar245 * fVar240;
    auVar249._4_4_ = fVar247 * fVar246;
    auVar249._8_4_ = fVar219 * fVar218;
    auVar249._12_4_ = fVar263 * fVar262;
    auVar249._16_4_ = fVar181 * 0.0;
    auVar249._20_4_ = fVar16 * 0.0;
    auVar249._28_36_ = auVar248._28_36_;
    auVar249._24_4_ = fVar17 * 0.0;
    fVar200 = auVar260._28_4_;
    auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar199,CONCAT48(fVar198,CONCAT44(fVar197,fVar180))
                                                )),auVar90);
    fVar254 = auVar92._28_4_ + auVar141._0_4_;
    fVar232 = fVar254 + auVar257._28_4_ + auVar231._28_4_;
    auVar99._4_4_ = fVar156 * 0.16666667;
    auVar99._0_4_ = fVar137 * 0.16666667;
    auVar99._8_4_ = fVar157 * 0.16666667;
    auVar99._12_4_ = fVar158 * 0.16666667;
    auVar99._16_4_ = fVar159 * 0.16666667;
    auVar99._20_4_ = fVar160 * 0.16666667;
    auVar99._24_4_ = fVar161 * 0.16666667;
    auVar99._28_4_ = fVar254;
    auVar95._4_4_ =
         (auVar249._4_4_ * fVar246 * 12.0 + auVar249._4_4_ * fVar247 * 6.0 + fVar197 + auVar91._4_4_
         ) * 0.16666667;
    auVar95._0_4_ =
         (auVar249._0_4_ * fVar240 * 12.0 + auVar249._0_4_ * fVar245 * 6.0 + fVar180 + auVar91._0_4_
         ) * 0.16666667;
    auVar95._8_4_ =
         (auVar249._8_4_ * fVar218 * 12.0 + auVar249._8_4_ * fVar219 * 6.0 + fVar198 + auVar91._8_4_
         ) * 0.16666667;
    auVar95._12_4_ =
         (auVar249._12_4_ * fVar262 * 12.0 + auVar249._12_4_ * fVar263 * 6.0 +
         fVar199 + auVar91._12_4_) * 0.16666667;
    auVar95._16_4_ =
         (auVar249._16_4_ * fVar181 * 12.0 + auVar249._16_4_ * 0.0 * 6.0 + auVar91._16_4_ + 0.0) *
         0.16666667;
    auVar95._20_4_ =
         (auVar249._20_4_ * fVar16 * 12.0 + auVar249._20_4_ * 0.0 * 6.0 + auVar91._20_4_ + 0.0) *
         0.16666667;
    auVar95._24_4_ =
         (auVar249._24_4_ * fVar17 * 12.0 + auVar249._24_4_ * 0.0 * 6.0 + auVar91._24_4_ + 0.0) *
         0.16666667;
    auVar95._28_4_ = auVar257._28_4_;
    auVar96._4_4_ =
         (auVar92._4_4_ + fVar156 + auVar249._4_4_ * fVar247 * 12.0 + auVar249._4_4_ * fVar246 * 6.0
         ) * 0.16666667;
    auVar96._0_4_ =
         (auVar92._0_4_ + fVar137 + auVar249._0_4_ * fVar245 * 12.0 + auVar249._0_4_ * fVar240 * 6.0
         ) * 0.16666667;
    auVar96._8_4_ =
         (auVar92._8_4_ + fVar157 + auVar249._8_4_ * fVar219 * 12.0 + auVar249._8_4_ * fVar218 * 6.0
         ) * 0.16666667;
    auVar96._12_4_ =
         (auVar92._12_4_ + fVar158 +
         auVar249._12_4_ * fVar263 * 12.0 + auVar249._12_4_ * fVar262 * 6.0) * 0.16666667;
    auVar96._16_4_ =
         (auVar92._16_4_ + fVar159 + auVar249._16_4_ * 0.0 * 12.0 + auVar249._16_4_ * fVar181 * 6.0)
         * 0.16666667;
    auVar96._20_4_ =
         (auVar92._20_4_ + fVar160 + auVar249._20_4_ * 0.0 * 12.0 + auVar249._20_4_ * fVar16 * 6.0)
         * 0.16666667;
    auVar96._24_4_ =
         (auVar92._24_4_ + fVar161 + auVar249._24_4_ * 0.0 * 12.0 + auVar249._24_4_ * fVar17 * 6.0)
         * 0.16666667;
    auVar96._28_4_ = fVar200;
    fVar180 = fVar180 * 0.16666667;
    fVar197 = fVar197 * 0.16666667;
    fVar198 = fVar198 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    auVar97._28_4_ = fVar232;
    auVar97._0_28_ = ZEXT1628(CONCAT412(fVar199,CONCAT48(fVar198,CONCAT44(fVar197,fVar180))));
    auVar98._4_4_ = fStack_1dc * fVar197;
    auVar98._0_4_ = local_1e0 * fVar180;
    auVar98._8_4_ = fStack_1d8 * fVar198;
    auVar98._12_4_ = fStack_1d4 * fVar199;
    auVar98._16_4_ = fStack_1d0 * 0.0;
    auVar98._20_4_ = fStack_1cc * 0.0;
    auVar98._24_4_ = fStack_1c8 * 0.0;
    auVar98._28_4_ = 0;
    auVar100._4_4_ = (float)local_200._4_4_ * fVar197;
    auVar100._0_4_ = (float)local_200._0_4_ * fVar180;
    auVar100._8_4_ = fStack_1f8 * fVar198;
    auVar100._12_4_ = fStack_1f4 * fVar199;
    auVar100._16_4_ = fStack_1f0 * 0.0;
    auVar100._20_4_ = fStack_1ec * 0.0;
    auVar100._24_4_ = fStack_1e8 * 0.0;
    auVar100._28_4_ = auVar253._28_4_ + fVar200 + auVar91._28_4_ + 0.0;
    auVar91 = vmulps_avx512vl(local_260,auVar97);
    auVar101._4_4_ = local_280._4_4_ * fVar197;
    auVar101._0_4_ = local_280._0_4_ * fVar180;
    auVar101._8_4_ = local_280._8_4_ * fVar198;
    auVar101._12_4_ = local_280._12_4_ * fVar199;
    auVar101._16_4_ = local_280._16_4_ * 0.0;
    auVar101._20_4_ = local_280._20_4_ * 0.0;
    auVar101._24_4_ = local_280._24_4_ * 0.0;
    auVar101._28_4_ = fVar232;
    auVar92 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar273._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar274._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar275._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar101,auVar276._0_32_,auVar96);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar267._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar268._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar269._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar271._0_32_,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar270._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar264._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar265._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar94,auVar266._0_32_,auVar99);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar93 = vxorps_avx512vl(auVar89,auVar98);
    auVar99 = vxorps_avx512vl(ZEXT1632(auVar79),auVar98);
    auVar223._0_4_ = auVar99._0_4_ * fVar245;
    auVar223._4_4_ = auVar99._4_4_ * fVar247;
    auVar223._8_4_ = auVar99._8_4_ * fVar219;
    auVar223._12_4_ = auVar99._12_4_ * fVar263;
    auVar223._16_4_ = auVar99._16_4_ * 0.0;
    auVar223._20_4_ = auVar99._20_4_ * 0.0;
    auVar223._24_4_ = auVar99._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar94 = vmulps_avx512vl(auVar249._0_32_,auVar90);
    auVar91 = vsubps_avx(auVar223,auVar94);
    auVar102._4_4_ = auVar93._4_4_ * fVar246 * 0.5;
    auVar102._0_4_ = auVar93._0_4_ * fVar240 * 0.5;
    auVar102._8_4_ = auVar93._8_4_ * fVar218 * 0.5;
    auVar102._12_4_ = auVar93._12_4_ * fVar262 * 0.5;
    auVar102._16_4_ = auVar93._16_4_ * fVar181 * 0.5;
    auVar102._20_4_ = auVar93._20_4_ * fVar16 * 0.5;
    auVar102._24_4_ = auVar93._24_4_ * fVar17 * 0.5;
    auVar102._28_4_ = auVar89._28_4_;
    auVar104._4_4_ = auVar91._4_4_ * 0.5;
    auVar104._0_4_ = auVar91._0_4_ * 0.5;
    auVar104._8_4_ = auVar91._8_4_ * 0.5;
    auVar104._12_4_ = auVar91._12_4_ * 0.5;
    auVar104._16_4_ = auVar91._16_4_ * 0.5;
    auVar104._20_4_ = auVar91._20_4_ * 0.5;
    auVar104._24_4_ = auVar91._24_4_ * 0.5;
    auVar104._28_4_ = auVar91._28_4_;
    auVar105._4_4_ = (auVar94._4_4_ + fVar246 * fVar246) * 0.5;
    auVar105._0_4_ = (auVar94._0_4_ + fVar240 * fVar240) * 0.5;
    auVar105._8_4_ = (auVar94._8_4_ + fVar218 * fVar218) * 0.5;
    auVar105._12_4_ = (auVar94._12_4_ + fVar262 * fVar262) * 0.5;
    auVar105._16_4_ = (auVar94._16_4_ + fVar181 * fVar181) * 0.5;
    auVar105._20_4_ = (auVar94._20_4_ + fVar16 * fVar16) * 0.5;
    auVar105._24_4_ = (auVar94._24_4_ + fVar17 * fVar17) * 0.5;
    auVar105._28_4_ = auVar94._28_4_ + auVar239._28_4_;
    fVar240 = fVar245 * fVar245 * 0.5;
    fVar245 = fVar247 * fVar247 * 0.5;
    fVar246 = fVar219 * fVar219 * 0.5;
    fVar247 = fVar263 * fVar263 * 0.5;
    auVar106._28_4_ = auVar244._28_4_;
    auVar106._0_28_ = ZEXT1628(CONCAT412(fVar247,CONCAT48(fVar246,CONCAT44(fVar245,fVar240))));
    auVar110._4_4_ = fStack_1dc * fVar245;
    auVar110._0_4_ = local_1e0 * fVar240;
    auVar110._8_4_ = fStack_1d8 * fVar246;
    auVar110._12_4_ = fStack_1d4 * fVar247;
    auVar110._16_4_ = fStack_1d0 * 0.0;
    auVar110._20_4_ = fStack_1cc * 0.0;
    auVar110._24_4_ = fStack_1c8 * 0.0;
    auVar110._28_4_ = 0x3f000000;
    auVar111._4_4_ = (float)local_200._4_4_ * fVar245;
    auVar111._0_4_ = (float)local_200._0_4_ * fVar240;
    auVar111._8_4_ = fStack_1f8 * fVar246;
    auVar111._12_4_ = fStack_1f4 * fVar247;
    auVar111._16_4_ = fStack_1f0 * 0.0;
    auVar111._20_4_ = fStack_1ec * 0.0;
    auVar111._24_4_ = fStack_1e8 * 0.0;
    auVar111._28_4_ = auVar99._28_4_;
    auVar91 = vmulps_avx512vl(local_260,auVar106);
    auVar112._4_4_ = fVar245 * local_280._4_4_;
    auVar112._0_4_ = fVar240 * local_280._0_4_;
    auVar112._8_4_ = fVar246 * local_280._8_4_;
    auVar112._12_4_ = fVar247 * local_280._12_4_;
    auVar112._16_4_ = local_280._16_4_ * 0.0;
    auVar112._20_4_ = local_280._20_4_ * 0.0;
    auVar112._24_4_ = local_280._24_4_ * 0.0;
    auVar112._28_4_ = auVar244._28_4_;
    auVar89 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar273._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar111,auVar105,auVar274._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,auVar275._0_32_);
    auVar79 = vfmadd231ps_fma(auVar112,auVar276._0_32_,auVar105);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar267._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar268._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,auVar269._0_32_);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar271._0_32_,auVar104);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar270._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,auVar264._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar102,auVar265._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar266._0_32_,auVar102);
    auVar118._4_4_ = auVar89._4_4_ * fVar18;
    auVar118._0_4_ = auVar89._0_4_ * fVar18;
    auVar118._8_4_ = auVar89._8_4_ * fVar18;
    auVar118._12_4_ = auVar89._12_4_ * fVar18;
    auVar118._16_4_ = auVar89._16_4_ * fVar18;
    auVar118._20_4_ = auVar89._20_4_ * fVar18;
    auVar118._24_4_ = auVar89._24_4_ * fVar18;
    auVar118._28_4_ = auVar276._28_4_;
    auVar257 = ZEXT3264(auVar118);
    auVar119._4_4_ = auVar93._4_4_ * fVar18;
    auVar119._0_4_ = auVar93._0_4_ * fVar18;
    auVar119._8_4_ = auVar93._8_4_ * fVar18;
    auVar119._12_4_ = auVar93._12_4_ * fVar18;
    auVar119._16_4_ = auVar93._16_4_ * fVar18;
    auVar119._20_4_ = auVar93._20_4_ * fVar18;
    auVar119._24_4_ = auVar93._24_4_ * fVar18;
    auVar119._28_4_ = fVar200;
    auVar260 = ZEXT3264(auVar119);
    auVar120._4_4_ = auVar91._4_4_ * fVar18;
    auVar120._0_4_ = auVar91._0_4_ * fVar18;
    auVar120._8_4_ = auVar91._8_4_ * fVar18;
    auVar120._12_4_ = auVar91._12_4_ * fVar18;
    auVar120._16_4_ = auVar91._16_4_ * fVar18;
    auVar120._20_4_ = auVar91._20_4_ * fVar18;
    auVar120._24_4_ = auVar91._24_4_ * fVar18;
    auVar120._28_4_ = auVar91._28_4_;
    fVar200 = auVar99._0_4_ * fVar18;
    fVar240 = auVar99._4_4_ * fVar18;
    auVar113._4_4_ = fVar240;
    auVar113._0_4_ = fVar200;
    fVar245 = auVar99._8_4_ * fVar18;
    auVar113._8_4_ = fVar245;
    fVar246 = auVar99._12_4_ * fVar18;
    auVar113._12_4_ = fVar246;
    fVar247 = auVar99._16_4_ * fVar18;
    auVar113._16_4_ = fVar247;
    fVar218 = auVar99._20_4_ * fVar18;
    auVar113._20_4_ = fVar218;
    fVar219 = auVar99._24_4_ * fVar18;
    auVar113._24_4_ = fVar219;
    auVar113._28_4_ = fVar18;
    auVar79 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
    auVar100 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,ZEXT1632(auVar79));
    auVar244 = ZEXT3264(auVar100);
    auVar101 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar79));
    auVar248 = ZEXT3264(auVar101);
    auVar89 = ZEXT1632(auVar79);
    auVar102 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar89);
    auVar253 = ZEXT3264(auVar102);
    auVar224._0_4_ = fVar200 + auVar92._0_4_;
    auVar224._4_4_ = fVar240 + auVar92._4_4_;
    auVar224._8_4_ = fVar245 + auVar92._8_4_;
    auVar224._12_4_ = fVar246 + auVar92._12_4_;
    auVar224._16_4_ = fVar247 + auVar92._16_4_;
    auVar224._20_4_ = fVar218 + auVar92._20_4_;
    auVar224._24_4_ = fVar219 + auVar92._24_4_;
    auVar224._28_4_ = fVar18 + auVar92._28_4_;
    auVar91 = vmaxps_avx(auVar92,auVar224);
    auVar88 = vminps_avx(auVar92,auVar224);
    auVar103 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,auVar89);
    auVar104 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar89);
    auVar105 = vpermt2ps_avx512vl(auVar119,_DAT_01fb9fc0,auVar89);
    auVar223 = ZEXT1632(auVar79);
    auVar106 = vpermt2ps_avx512vl(auVar120,_DAT_01fb9fc0,auVar223);
    auVar89 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar223);
    auVar89 = vsubps_avx(auVar103,auVar89);
    auVar92 = vsubps_avx(auVar100,auVar95);
    auVar239 = ZEXT3264(auVar92);
    auVar93 = vsubps_avx(auVar101,auVar96);
    auVar99 = vsubps_avx(auVar102,auVar97);
    auVar231 = ZEXT3264(auVar99);
    auVar94 = vmulps_avx512vl(auVar93,auVar120);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar119,auVar99);
    auVar107 = vmulps_avx512vl(auVar99,auVar118);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar120,auVar92);
    auVar108 = vmulps_avx512vl(auVar92,auVar119);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar118,auVar93);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar94);
    auVar94 = vmulps_avx512vl(auVar99,auVar99);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar109 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar92);
    auVar108 = vrcp14ps_avx512vl(auVar109);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar94 = vfnmadd213ps_avx512vl(auVar108,auVar109,auVar94);
    auVar94 = vfmadd132ps_avx512vl(auVar94,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar107,auVar94);
    auVar108 = vmulps_avx512vl(auVar93,auVar106);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar105,auVar99);
    auVar110 = vmulps_avx512vl(auVar99,auVar104);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar106,auVar92);
    auVar111 = vmulps_avx512vl(auVar92,auVar105);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar104,auVar93);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar108);
    auVar94 = vmulps_avx512vl(auVar108,auVar94);
    auVar94 = vmaxps_avx512vl(auVar107,auVar94);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar107 = vmaxps_avx512vl(auVar89,auVar103);
    auVar91 = vmaxps_avx512vl(auVar91,auVar107);
    auVar110 = vaddps_avx512vl(auVar94,auVar91);
    auVar91 = vminps_avx(auVar89,auVar103);
    auVar91 = vminps_avx(auVar88,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar94);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar88 = vmulps_avx512vl(auVar110,auVar103);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    local_8c0 = vmulps_avx512vl(auVar91,auVar107);
    auVar91 = vmulps_avx512vl(auVar88,auVar88);
    auVar88 = vrsqrt14ps_avx512vl(auVar109);
    auVar108._8_4_ = 0xbf000000;
    auVar108._0_8_ = 0xbf000000bf000000;
    auVar108._12_4_ = 0xbf000000;
    auVar108._16_4_ = 0xbf000000;
    auVar108._20_4_ = 0xbf000000;
    auVar108._24_4_ = 0xbf000000;
    auVar108._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar109,auVar108);
    fVar200 = auVar88._0_4_;
    fVar240 = auVar88._4_4_;
    fVar245 = auVar88._8_4_;
    fVar246 = auVar88._12_4_;
    fVar247 = auVar88._16_4_;
    fVar218 = auVar88._20_4_;
    fVar219 = auVar88._24_4_;
    auVar114._4_4_ = fVar240 * fVar240 * fVar240 * auVar89._4_4_;
    auVar114._0_4_ = fVar200 * fVar200 * fVar200 * auVar89._0_4_;
    auVar114._8_4_ = fVar245 * fVar245 * fVar245 * auVar89._8_4_;
    auVar114._12_4_ = fVar246 * fVar246 * fVar246 * auVar89._12_4_;
    auVar114._16_4_ = fVar247 * fVar247 * fVar247 * auVar89._16_4_;
    auVar114._20_4_ = fVar218 * fVar218 * fVar218 * auVar89._20_4_;
    auVar114._24_4_ = fVar219 * fVar219 * fVar219 * auVar89._24_4_;
    auVar114._28_4_ = auVar110._28_4_;
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar88 = vfmadd231ps_avx512vl(auVar114,auVar88,auVar109);
    auVar89 = vmulps_avx512vl(auVar92,auVar88);
    auVar94 = vmulps_avx512vl(auVar93,auVar88);
    auVar103 = vmulps_avx512vl(auVar99,auVar88);
    auVar107 = vsubps_avx512vl(auVar223,auVar95);
    auVar108 = vsubps_avx512vl(auVar223,auVar96);
    auVar109 = vsubps_avx512vl(auVar223,auVar97);
    auVar115._4_4_ = uStack_41c;
    auVar115._0_4_ = local_420;
    auVar115._8_4_ = uStack_418;
    auVar115._12_4_ = uStack_414;
    auVar115._16_4_ = uStack_410;
    auVar115._20_4_ = uStack_40c;
    auVar115._24_4_ = uStack_408;
    auVar115._28_4_ = uStack_404;
    auVar110 = vmulps_avx512vl(auVar115,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar272._0_32_,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_340,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(auVar115,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar94,auVar272._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar89,local_340);
    auVar103 = vmulps_avx512vl(auVar109,auVar103);
    auVar94 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar94);
    auVar89 = vfmadd231ps_avx512vl(auVar94,auVar107,auVar89);
    auVar94 = vmulps_avx512vl(auVar112,auVar112);
    auVar103 = vsubps_avx512vl(local_220,auVar94);
    auVar113 = vmulps_avx512vl(auVar112,auVar89);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar89,auVar89);
    local_5e0 = vsubps_avx512vl(auVar111,auVar113);
    auVar91 = vsubps_avx512vl(local_5e0,auVar91);
    local_520 = vmulps_avx512vl(auVar110,auVar110);
    _local_540 = vmulps_avx512vl(auVar103,auVar90);
    auVar111 = vmulps_avx512vl(_local_540,auVar91);
    auVar111 = vsubps_avx512vl(local_520,auVar111);
    auVar79 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
    uVar63 = vcmpps_avx512vl(auVar111,auVar223,5);
    bVar55 = (byte)uVar63;
    if (bVar55 == 0) {
LAB_018ca35b:
      auVar272 = ZEXT3264(local_6c0);
      auVar270 = ZEXT3264(local_7c0);
      auVar91 = vmovdqa64_avx512vl(local_7e0);
      auVar264 = ZEXT3264(auVar91);
      auVar265 = ZEXT3264(local_800);
      auVar266 = ZEXT3264(local_820);
      auVar267 = ZEXT3264(local_840);
      auVar268 = ZEXT3264(local_860);
      auVar269 = ZEXT3264(local_880);
      auVar271 = ZEXT3264(local_8a0);
      auVar273 = ZEXT3264(local_6e0);
      auVar274 = ZEXT3264(local_700);
      auVar275 = ZEXT3264(local_720);
      auVar276 = ZEXT3264(local_7a0);
    }
    else {
      auVar113 = _local_540;
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar114 = vaddps_avx512vl(auVar103,auVar103);
      local_680 = vrcp14ps_avx512vl(auVar114);
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = 0x3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar90._16_4_ = 0x3f800000;
      auVar90._20_4_ = 0x3f800000;
      auVar90._24_4_ = 0x3f800000;
      auVar90._28_4_ = 0x3f800000;
      auVar115 = vfnmadd213ps_avx512vl(local_680,auVar114,auVar90);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_680,local_680);
      _local_460 = vxorps_avx512vl(auVar110,auVar98);
      auVar98 = vsubps_avx512vl(_local_460,auVar111);
      local_440 = vmulps_avx512vl(auVar98,auVar115);
      auVar98 = vsubps_avx512vl(auVar111,auVar110);
      local_660 = vmulps_avx512vl(auVar98,auVar115);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98 = vblendmps_avx512vl(auVar98,local_440);
      auVar116._0_4_ =
           (uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar115._0_4_;
      bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar62 * auVar98._4_4_ | (uint)!bVar62 * auVar115._4_4_;
      bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar62 * auVar98._8_4_ | (uint)!bVar62 * auVar115._8_4_;
      bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar62 * auVar98._12_4_ | (uint)!bVar62 * auVar115._12_4_;
      bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar62 * auVar98._16_4_ | (uint)!bVar62 * auVar115._16_4_;
      bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar62 * auVar98._20_4_ | (uint)!bVar62 * auVar115._20_4_;
      bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar62 * auVar98._24_4_ | (uint)!bVar62 * auVar115._24_4_;
      bVar62 = SUB81(uVar63 >> 7,0);
      auVar116._28_4_ = (uint)bVar62 * auVar98._28_4_ | (uint)!bVar62 * auVar115._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = vblendmps_avx512vl(auVar98,local_660);
      auVar117._0_4_ =
           (uint)(bVar55 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar98._0_4_;
      bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar62 * auVar111._4_4_ | (uint)!bVar62 * auVar98._4_4_;
      bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar62 * auVar111._8_4_ | (uint)!bVar62 * auVar98._8_4_;
      bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar62 * auVar111._12_4_ | (uint)!bVar62 * auVar98._12_4_;
      bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar62 * auVar111._16_4_ | (uint)!bVar62 * auVar98._16_4_;
      bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar62 * auVar111._20_4_ | (uint)!bVar62 * auVar98._20_4_;
      bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar62 * auVar111._24_4_ | (uint)!bVar62 * auVar98._24_4_;
      bVar62 = SUB81(uVar63 >> 7,0);
      auVar117._28_4_ = (uint)bVar62 * auVar111._28_4_ | (uint)!bVar62 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar98);
      local_480 = vmaxps_avx512vl(local_240,auVar98);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_4a0 = vmulps_avx512vl(local_480,auVar31);
      vandps_avx512vl(auVar103,auVar98);
      uVar21 = vcmpps_avx512vl(local_4a0,local_4a0,1);
      uVar63 = uVar63 & uVar21;
      bVar60 = (byte)uVar63;
      if (bVar60 != 0) {
        uVar21 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar79),2);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = vblendmps_avx512vl(auVar91,auVar94);
        bVar59 = (byte)uVar21;
        uVar64 = (uint)(bVar59 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar91._0_4_;
        bVar62 = (bool)((byte)(uVar21 >> 1) & 1);
        uVar130 = (uint)bVar62 * auVar103._4_4_ | (uint)!bVar62 * auVar91._4_4_;
        bVar62 = (bool)((byte)(uVar21 >> 2) & 1);
        uVar131 = (uint)bVar62 * auVar103._8_4_ | (uint)!bVar62 * auVar91._8_4_;
        bVar62 = (bool)((byte)(uVar21 >> 3) & 1);
        uVar132 = (uint)bVar62 * auVar103._12_4_ | (uint)!bVar62 * auVar91._12_4_;
        bVar62 = (bool)((byte)(uVar21 >> 4) & 1);
        uVar133 = (uint)bVar62 * auVar103._16_4_ | (uint)!bVar62 * auVar91._16_4_;
        bVar62 = (bool)((byte)(uVar21 >> 5) & 1);
        uVar134 = (uint)bVar62 * auVar103._20_4_ | (uint)!bVar62 * auVar91._20_4_;
        bVar62 = (bool)((byte)(uVar21 >> 6) & 1);
        uVar135 = (uint)bVar62 * auVar103._24_4_ | (uint)!bVar62 * auVar91._24_4_;
        bVar62 = SUB81(uVar21 >> 7,0);
        uVar136 = (uint)bVar62 * auVar103._28_4_ | (uint)!bVar62 * auVar91._28_4_;
        auVar116._0_4_ = (bVar60 & 1) * uVar64 | !(bool)(bVar60 & 1) * auVar116._0_4_;
        bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar116._4_4_ = bVar62 * uVar130 | !bVar62 * auVar116._4_4_;
        bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar116._8_4_ = bVar62 * uVar131 | !bVar62 * auVar116._8_4_;
        bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar116._12_4_ = bVar62 * uVar132 | !bVar62 * auVar116._12_4_;
        bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar116._16_4_ = bVar62 * uVar133 | !bVar62 * auVar116._16_4_;
        bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar116._20_4_ = bVar62 * uVar134 | !bVar62 * auVar116._20_4_;
        bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar116._24_4_ = bVar62 * uVar135 | !bVar62 * auVar116._24_4_;
        bVar62 = SUB81(uVar63 >> 7,0);
        auVar116._28_4_ = bVar62 * uVar136 | !bVar62 * auVar116._28_4_;
        auVar91 = vblendmps_avx512vl(auVar94,auVar91);
        bVar62 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar21 >> 6) & 1);
        bVar15 = SUB81(uVar21 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar60 & 1) *
             ((uint)(bVar59 & 1) * auVar91._0_4_ | !(bool)(bVar59 & 1) * uVar64) |
             !(bool)(bVar60 & 1) * auVar117._0_4_;
        bVar9 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar9 * ((uint)bVar62 * auVar91._4_4_ | !bVar62 * uVar130) |
             !bVar9 * auVar117._4_4_;
        bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar62 * ((uint)bVar10 * auVar91._8_4_ | !bVar10 * uVar131) |
             !bVar62 * auVar117._8_4_;
        bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar62 * ((uint)bVar11 * auVar91._12_4_ | !bVar11 * uVar132) |
             !bVar62 * auVar117._12_4_;
        bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar62 * ((uint)bVar12 * auVar91._16_4_ | !bVar12 * uVar133) |
             !bVar62 * auVar117._16_4_;
        bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar62 * ((uint)bVar13 * auVar91._20_4_ | !bVar13 * uVar134) |
             !bVar62 * auVar117._20_4_;
        bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar62 * ((uint)bVar14 * auVar91._24_4_ | !bVar14 * uVar135) |
             !bVar62 * auVar117._24_4_;
        bVar62 = SUB81(uVar63 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar62 * ((uint)bVar15 * auVar91._28_4_ | !bVar15 * uVar136) |
             !bVar62 * auVar117._28_4_;
        bVar55 = (~bVar60 | bVar59) & bVar55;
      }
      auVar51._4_4_ = uStack_41c;
      auVar51._0_4_ = local_420;
      auVar51._8_4_ = uStack_418;
      auVar51._12_4_ = uStack_414;
      auVar51._16_4_ = uStack_410;
      auVar51._20_4_ = uStack_40c;
      auVar51._24_4_ = uStack_408;
      auVar51._28_4_ = uStack_404;
      auVar276 = ZEXT3264(local_7a0);
      if ((bVar55 & 0x7f) == 0) {
        auVar272 = ZEXT3264(local_6c0);
        auVar270 = ZEXT3264(local_7c0);
        auVar91 = vmovdqa64_avx512vl(local_7e0);
        auVar264 = ZEXT3264(auVar91);
        auVar265 = ZEXT3264(local_800);
        auVar266 = ZEXT3264(local_820);
        auVar267 = ZEXT3264(local_840);
        auVar268 = ZEXT3264(local_860);
        auVar269 = ZEXT3264(local_880);
        auVar271 = ZEXT3264(local_8a0);
        auVar273 = ZEXT3264(local_6e0);
        auVar274 = ZEXT3264(local_700);
        auVar275 = ZEXT3264(local_720);
      }
      else {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar106 = vxorps_avx512vl(auVar106,auVar98);
        auVar104 = vxorps_avx512vl(auVar104,auVar98);
        auVar105 = vxorps_avx512vl(auVar105,auVar98);
        auVar79 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_500);
        auVar91 = vbroadcastss_avx512vl(auVar79);
        auVar91 = vmaxps_avx512vl(auVar91,auVar116);
        auVar79 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_500);
        auVar94 = vbroadcastss_avx512vl(auVar79);
        auVar94 = vminps_avx512vl(auVar94,auVar117);
        auVar103 = vmulps_avx512vl(auVar120,auVar109);
        auVar103 = vfmadd213ps_avx512vl(auVar108,auVar119,auVar103);
        auVar79 = vfmadd213ps_fma(auVar107,auVar118,auVar103);
        auVar103 = vmulps_avx512vl(auVar51,auVar120);
        auVar272 = ZEXT3264(local_6c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_6c0,auVar119);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_340,auVar118);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar103,auVar107);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar20 = vcmpps_avx512vl(auVar107,auVar108,1);
        auVar109 = vxorps_avx512vl(ZEXT1632(auVar79),auVar98);
        auVar111 = vrcp14ps_avx512vl(auVar103);
        auVar118 = vxorps_avx512vl(auVar103,auVar98);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar120 = vfnmadd213ps_avx512vl(auVar111,auVar103,auVar119);
        auVar79 = vfmadd132ps_fma(auVar120,auVar111,auVar111);
        fVar200 = auVar79._0_4_ * auVar109._0_4_;
        fVar240 = auVar79._4_4_ * auVar109._4_4_;
        auVar38._4_4_ = fVar240;
        auVar38._0_4_ = fVar200;
        fVar245 = auVar79._8_4_ * auVar109._8_4_;
        auVar38._8_4_ = fVar245;
        fVar246 = auVar79._12_4_ * auVar109._12_4_;
        auVar38._12_4_ = fVar246;
        fVar247 = auVar109._16_4_ * 0.0;
        auVar38._16_4_ = fVar247;
        fVar218 = auVar109._20_4_ * 0.0;
        auVar38._20_4_ = fVar218;
        fVar219 = auVar109._24_4_ * 0.0;
        auVar38._24_4_ = fVar219;
        auVar38._28_4_ = auVar109._28_4_;
        uVar23 = vcmpps_avx512vl(auVar103,auVar118,1);
        bVar60 = (byte)uVar20 | (byte)uVar23;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar115 = vblendmps_avx512vl(auVar38,auVar120);
        auVar121._0_4_ =
             (uint)(bVar60 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar111._0_4_;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar62 * auVar115._4_4_ | (uint)!bVar62 * auVar111._4_4_;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar62 * auVar115._8_4_ | (uint)!bVar62 * auVar111._8_4_;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar62 * auVar115._12_4_ | (uint)!bVar62 * auVar111._12_4_;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar62 * auVar115._16_4_ | (uint)!bVar62 * auVar111._16_4_;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar62 * auVar115._20_4_ | (uint)!bVar62 * auVar111._20_4_;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar62 * auVar115._24_4_ | (uint)!bVar62 * auVar111._24_4_;
        auVar121._28_4_ =
             (uint)(bVar60 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar111._28_4_;
        auVar111 = vmaxps_avx512vl(auVar91,auVar121);
        auVar257 = ZEXT3264(auVar111);
        uVar23 = vcmpps_avx512vl(auVar103,auVar118,6);
        bVar60 = (byte)uVar20 | (byte)uVar23;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122._0_4_ =
             (uint)(bVar60 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)fVar200;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar62 * auVar118._4_4_ | (uint)!bVar62 * (int)fVar240;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar62 * auVar118._8_4_ | (uint)!bVar62 * (int)fVar245;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar62 * auVar118._12_4_ | (uint)!bVar62 * (int)fVar246;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar62 * auVar118._16_4_ | (uint)!bVar62 * (int)fVar247;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar62 * auVar118._20_4_ | (uint)!bVar62 * (int)fVar218;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar62 * auVar118._24_4_ | (uint)!bVar62 * (int)fVar219;
        auVar122._28_4_ =
             (uint)(bVar60 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar109._28_4_;
        auVar109 = vminps_avx512vl(auVar94,auVar122);
        auVar91 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
        auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
        auVar100 = ZEXT832(0) << 0x20;
        auVar103 = vsubps_avx(auVar100,auVar102);
        auVar103 = vmulps_avx512vl(auVar103,auVar106);
        auVar94 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar94);
        auVar91 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar91);
        auVar94 = vmulps_avx512vl(auVar51,auVar106);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_6c0,auVar105);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_340,auVar104);
        vandps_avx512vl(auVar94,auVar107);
        uVar20 = vcmpps_avx512vl(auVar94,auVar108,1);
        auVar91 = vxorps_avx512vl(auVar91,auVar98);
        auVar103 = vrcp14ps_avx512vl(auVar94);
        auVar107 = vxorps_avx512vl(auVar94,auVar98);
        auVar253 = ZEXT3264(auVar107);
        auVar108 = vfnmadd213ps_avx512vl(auVar103,auVar94,auVar119);
        auVar79 = vfmadd132ps_fma(auVar108,auVar103,auVar103);
        auVar260 = ZEXT1664(auVar79);
        fVar200 = auVar79._0_4_ * auVar91._0_4_;
        fVar240 = auVar79._4_4_ * auVar91._4_4_;
        auVar39._4_4_ = fVar240;
        auVar39._0_4_ = fVar200;
        fVar245 = auVar79._8_4_ * auVar91._8_4_;
        auVar39._8_4_ = fVar245;
        fVar246 = auVar79._12_4_ * auVar91._12_4_;
        auVar39._12_4_ = fVar246;
        fVar247 = auVar91._16_4_ * 0.0;
        auVar39._16_4_ = fVar247;
        fVar218 = auVar91._20_4_ * 0.0;
        auVar39._20_4_ = fVar218;
        fVar219 = auVar91._24_4_ * 0.0;
        auVar39._24_4_ = fVar219;
        auVar39._28_4_ = auVar91._28_4_;
        uVar23 = vcmpps_avx512vl(auVar94,auVar107,1);
        bVar60 = (byte)uVar20 | (byte)uVar23;
        auVar108 = vblendmps_avx512vl(auVar39,auVar120);
        auVar123._0_4_ =
             (uint)(bVar60 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar103._0_4_;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar62 * auVar108._4_4_ | (uint)!bVar62 * auVar103._4_4_;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar62 * auVar108._8_4_ | (uint)!bVar62 * auVar103._8_4_;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar62 * auVar108._12_4_ | (uint)!bVar62 * auVar103._12_4_;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar62 * auVar108._16_4_ | (uint)!bVar62 * auVar103._16_4_;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar62 * auVar108._20_4_ | (uint)!bVar62 * auVar103._20_4_;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar62 * auVar108._24_4_ | (uint)!bVar62 * auVar103._24_4_;
        auVar123._28_4_ =
             (uint)(bVar60 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar103._28_4_;
        local_400 = vmaxps_avx(auVar111,auVar123);
        auVar248 = ZEXT3264(local_400);
        uVar23 = vcmpps_avx512vl(auVar94,auVar107,6);
        bVar60 = (byte)uVar20 | (byte)uVar23;
        auVar124._0_4_ =
             (uint)(bVar60 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)fVar200;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar62 * auVar118._4_4_ | (uint)!bVar62 * (int)fVar240;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar62 * auVar118._8_4_ | (uint)!bVar62 * (int)fVar245;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar62 * auVar118._12_4_ | (uint)!bVar62 * (int)fVar246;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar62 * auVar118._16_4_ | (uint)!bVar62 * (int)fVar247;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar62 * auVar118._20_4_ | (uint)!bVar62 * (int)fVar218;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar62 * auVar118._24_4_ | (uint)!bVar62 * (int)fVar219;
        auVar124._28_4_ =
             (uint)(bVar60 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar91._28_4_;
        local_2c0 = vminps_avx(auVar109,auVar124);
        auVar244 = ZEXT3264(local_2c0);
        uVar20 = vcmpps_avx512vl(local_400,local_2c0,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar20;
        if (bVar55 == 0) goto LAB_018ca35b;
        auVar91 = vmaxps_avx(auVar100,local_8c0);
        auVar94 = vfmadd213ps_avx512vl(local_440,auVar112,auVar89);
        fVar200 = auVar88._0_4_;
        fVar240 = auVar88._4_4_;
        auVar40._4_4_ = fVar240 * auVar94._4_4_;
        auVar40._0_4_ = fVar200 * auVar94._0_4_;
        fVar245 = auVar88._8_4_;
        auVar40._8_4_ = fVar245 * auVar94._8_4_;
        fVar246 = auVar88._12_4_;
        auVar40._12_4_ = fVar246 * auVar94._12_4_;
        fVar247 = auVar88._16_4_;
        auVar40._16_4_ = fVar247 * auVar94._16_4_;
        fVar218 = auVar88._20_4_;
        auVar40._20_4_ = fVar218 * auVar94._20_4_;
        fVar219 = auVar88._24_4_;
        auVar40._24_4_ = fVar219 * auVar94._24_4_;
        auVar40._28_4_ = auVar94._28_4_;
        auVar94 = vfmadd213ps_avx512vl(local_660,auVar112,auVar89);
        auVar41._4_4_ = fVar240 * auVar94._4_4_;
        auVar41._0_4_ = fVar200 * auVar94._0_4_;
        auVar41._8_4_ = fVar245 * auVar94._8_4_;
        auVar41._12_4_ = fVar246 * auVar94._12_4_;
        auVar41._16_4_ = fVar247 * auVar94._16_4_;
        auVar41._20_4_ = fVar218 * auVar94._20_4_;
        auVar41._24_4_ = fVar219 * auVar94._24_4_;
        auVar41._28_4_ = auVar94._28_4_;
        auVar94 = vminps_avx512vl(auVar40,auVar119);
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar94 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
        auVar107 = vminps_avx512vl(auVar41,auVar119);
        auVar42._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar94._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar42,local_6a0,local_640);
        auVar94 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
        auVar43._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar94._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar43,local_6a0,local_640);
        auVar44._4_4_ = auVar91._4_4_ * auVar91._4_4_;
        auVar44._0_4_ = auVar91._0_4_ * auVar91._0_4_;
        auVar44._8_4_ = auVar91._8_4_ * auVar91._8_4_;
        auVar44._12_4_ = auVar91._12_4_ * auVar91._12_4_;
        auVar44._16_4_ = auVar91._16_4_ * auVar91._16_4_;
        auVar44._20_4_ = auVar91._20_4_ * auVar91._20_4_;
        auVar44._24_4_ = auVar91._24_4_ * auVar91._24_4_;
        auVar44._28_4_ = auVar91._28_4_;
        auVar94 = vsubps_avx(local_5e0,auVar44);
        auVar45._4_4_ = auVar94._4_4_ * (float)local_540._4_4_;
        auVar45._0_4_ = auVar94._0_4_ * (float)local_540._0_4_;
        auVar45._8_4_ = auVar94._8_4_ * fStack_538;
        auVar45._12_4_ = auVar94._12_4_ * fStack_534;
        auVar45._16_4_ = auVar94._16_4_ * fStack_530;
        auVar45._20_4_ = auVar94._20_4_ * fStack_52c;
        auVar45._24_4_ = auVar94._24_4_ * fStack_528;
        auVar45._28_4_ = auVar91._28_4_;
        auVar91 = vsubps_avx(local_520,auVar45);
        uVar20 = vcmpps_avx512vl(auVar91,ZEXT832(0) << 0x20,5);
        bVar60 = (byte)uVar20;
        auVar273 = ZEXT3264(local_6e0);
        auVar274 = ZEXT3264(local_700);
        auVar275 = ZEXT3264(local_720);
        auVar276 = ZEXT3264(local_7a0);
        if (bVar60 == 0) {
          bVar60 = 0;
          auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar260 = ZEXT864(0) << 0x20;
          auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar248 = ZEXT864(0) << 0x20;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar126._8_4_ = 0xff800000;
          auVar126._0_8_ = 0xff800000ff800000;
          auVar126._12_4_ = 0xff800000;
          auVar126._16_4_ = 0xff800000;
          auVar126._20_4_ = 0xff800000;
          auVar126._24_4_ = 0xff800000;
          auVar126._28_4_ = 0xff800000;
        }
        else {
          auVar85 = vxorps_avx512vl(auVar141,auVar141);
          uVar63 = vcmpps_avx512vl(auVar91,auVar100,5);
          auVar91 = vsqrtps_avx(auVar91);
          auVar103 = vfnmadd213ps_avx512vl(auVar114,local_680,auVar119);
          auVar108 = vfmadd132ps_avx512vl(auVar103,local_680,local_680);
          auVar103 = vsubps_avx(_local_460,auVar91);
          auVar109 = vmulps_avx512vl(auVar103,auVar108);
          auVar91 = vsubps_avx512vl(auVar91,auVar110);
          auVar98 = vmulps_avx512vl(auVar91,auVar108);
          auVar91 = vfmadd213ps_avx512vl(auVar112,auVar109,auVar89);
          auVar46._4_4_ = fVar240 * auVar91._4_4_;
          auVar46._0_4_ = fVar200 * auVar91._0_4_;
          auVar46._8_4_ = fVar245 * auVar91._8_4_;
          auVar46._12_4_ = fVar246 * auVar91._12_4_;
          auVar46._16_4_ = fVar247 * auVar91._16_4_;
          auVar46._20_4_ = fVar218 * auVar91._20_4_;
          auVar46._24_4_ = fVar219 * auVar91._24_4_;
          auVar46._28_4_ = auVar107._28_4_;
          auVar91 = vmulps_avx512vl(local_340,auVar109);
          auVar103 = vmulps_avx512vl(local_6c0,auVar109);
          auVar52._4_4_ = uStack_41c;
          auVar52._0_4_ = local_420;
          auVar52._8_4_ = uStack_418;
          auVar52._12_4_ = uStack_414;
          auVar52._16_4_ = uStack_410;
          auVar52._20_4_ = uStack_40c;
          auVar52._24_4_ = uStack_408;
          auVar52._28_4_ = uStack_404;
          auVar100 = vmulps_avx512vl(auVar52,auVar109);
          auVar107 = vfmadd213ps_avx512vl(auVar92,auVar46,auVar95);
          auVar107 = vsubps_avx512vl(auVar91,auVar107);
          auVar91 = vfmadd213ps_avx512vl(auVar93,auVar46,auVar96);
          auVar108 = vsubps_avx512vl(auVar103,auVar91);
          auVar79 = vfmadd213ps_fma(auVar46,auVar99,auVar97);
          auVar91 = vsubps_avx(auVar100,ZEXT1632(auVar79));
          auVar248 = ZEXT3264(auVar91);
          auVar91 = vfmadd213ps_avx512vl(auVar112,auVar98,auVar89);
          auVar47._4_4_ = fVar240 * auVar91._4_4_;
          auVar47._0_4_ = fVar200 * auVar91._0_4_;
          auVar47._8_4_ = fVar245 * auVar91._8_4_;
          auVar47._12_4_ = fVar246 * auVar91._12_4_;
          auVar47._16_4_ = fVar247 * auVar91._16_4_;
          auVar47._20_4_ = fVar218 * auVar91._20_4_;
          auVar47._24_4_ = fVar219 * auVar91._24_4_;
          auVar47._28_4_ = auVar88._28_4_;
          auVar91 = vmulps_avx512vl(local_340,auVar98);
          auVar88 = vmulps_avx512vl(local_6c0,auVar98);
          auVar89 = vmulps_avx512vl(auVar52,auVar98);
          auVar79 = vfmadd213ps_fma(auVar92,auVar47,auVar95);
          auVar103 = vsubps_avx(auVar91,ZEXT1632(auVar79));
          auVar79 = vfmadd213ps_fma(auVar93,auVar47,auVar96);
          auVar91 = vsubps_avx(auVar88,ZEXT1632(auVar79));
          auVar79 = vfmadd213ps_fma(auVar99,auVar47,auVar97);
          auVar88 = vsubps_avx512vl(auVar89,ZEXT1632(auVar79));
          auVar260 = ZEXT3264(auVar88);
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar88 = vblendmps_avx512vl(auVar150,auVar109);
          bVar62 = (bool)((byte)uVar63 & 1);
          auVar125._0_4_ = (uint)bVar62 * auVar88._0_4_ | (uint)!bVar62 * auVar95._0_4_;
          bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar62 * auVar88._4_4_ | (uint)!bVar62 * auVar95._4_4_;
          bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar62 * auVar88._8_4_ | (uint)!bVar62 * auVar95._8_4_;
          bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar62 * auVar88._12_4_ | (uint)!bVar62 * auVar95._12_4_;
          bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar62 * auVar88._16_4_ | (uint)!bVar62 * auVar95._16_4_;
          bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar62 * auVar88._20_4_ | (uint)!bVar62 * auVar95._20_4_;
          bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar62 * auVar88._24_4_ | (uint)!bVar62 * auVar95._24_4_;
          bVar62 = SUB81(uVar63 >> 7,0);
          auVar125._28_4_ = (uint)bVar62 * auVar88._28_4_ | (uint)!bVar62 * auVar95._28_4_;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar151,auVar98);
          bVar62 = (bool)((byte)uVar63 & 1);
          auVar126._0_4_ = (uint)bVar62 * auVar88._0_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar62 * auVar88._4_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar62 * auVar88._8_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar62 * auVar88._12_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar62 * auVar88._16_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar62 * auVar88._20_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar62 * auVar88._24_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = SUB81(uVar63 >> 7,0);
          auVar126._28_4_ = (uint)bVar62 * auVar88._28_4_ | (uint)!bVar62 * -0x800000;
          auVar32._8_4_ = 0x36000000;
          auVar32._0_8_ = 0x3600000036000000;
          auVar32._12_4_ = 0x36000000;
          auVar32._16_4_ = 0x36000000;
          auVar32._20_4_ = 0x36000000;
          auVar32._24_4_ = 0x36000000;
          auVar32._28_4_ = 0x36000000;
          auVar88 = vmulps_avx512vl(local_480,auVar32);
          uVar21 = vcmpps_avx512vl(auVar88,local_4a0,0xe);
          uVar63 = uVar63 & uVar21;
          bVar59 = (byte)uVar63;
          if (bVar59 != 0) {
            uVar21 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar85),2);
            auVar237._8_4_ = 0x7f800000;
            auVar237._0_8_ = 0x7f8000007f800000;
            auVar237._12_4_ = 0x7f800000;
            auVar237._16_4_ = 0x7f800000;
            auVar237._20_4_ = 0x7f800000;
            auVar237._24_4_ = 0x7f800000;
            auVar237._28_4_ = 0x7f800000;
            auVar256._8_4_ = 0xff800000;
            auVar256._0_8_ = 0xff800000ff800000;
            auVar256._12_4_ = 0xff800000;
            auVar256._16_4_ = 0xff800000;
            auVar256._20_4_ = 0xff800000;
            auVar256._24_4_ = 0xff800000;
            auVar256._28_4_ = 0xff800000;
            auVar89 = vblendmps_avx512vl(auVar237,auVar256);
            bVar56 = (byte)uVar21;
            uVar64 = (uint)(bVar56 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar88._0_4_;
            bVar62 = (bool)((byte)(uVar21 >> 1) & 1);
            uVar130 = (uint)bVar62 * auVar89._4_4_ | (uint)!bVar62 * auVar88._4_4_;
            bVar62 = (bool)((byte)(uVar21 >> 2) & 1);
            uVar131 = (uint)bVar62 * auVar89._8_4_ | (uint)!bVar62 * auVar88._8_4_;
            bVar62 = (bool)((byte)(uVar21 >> 3) & 1);
            uVar132 = (uint)bVar62 * auVar89._12_4_ | (uint)!bVar62 * auVar88._12_4_;
            bVar62 = (bool)((byte)(uVar21 >> 4) & 1);
            uVar133 = (uint)bVar62 * auVar89._16_4_ | (uint)!bVar62 * auVar88._16_4_;
            bVar62 = (bool)((byte)(uVar21 >> 5) & 1);
            uVar134 = (uint)bVar62 * auVar89._20_4_ | (uint)!bVar62 * auVar88._20_4_;
            bVar62 = (bool)((byte)(uVar21 >> 6) & 1);
            uVar135 = (uint)bVar62 * auVar89._24_4_ | (uint)!bVar62 * auVar88._24_4_;
            bVar62 = SUB81(uVar21 >> 7,0);
            uVar136 = (uint)bVar62 * auVar89._28_4_ | (uint)!bVar62 * auVar88._28_4_;
            auVar125._0_4_ = (bVar59 & 1) * uVar64 | !(bool)(bVar59 & 1) * auVar125._0_4_;
            bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar125._4_4_ = bVar62 * uVar130 | !bVar62 * auVar125._4_4_;
            bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar125._8_4_ = bVar62 * uVar131 | !bVar62 * auVar125._8_4_;
            bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar125._12_4_ = bVar62 * uVar132 | !bVar62 * auVar125._12_4_;
            bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar125._16_4_ = bVar62 * uVar133 | !bVar62 * auVar125._16_4_;
            bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar125._20_4_ = bVar62 * uVar134 | !bVar62 * auVar125._20_4_;
            bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar125._24_4_ = bVar62 * uVar135 | !bVar62 * auVar125._24_4_;
            bVar62 = SUB81(uVar63 >> 7,0);
            auVar125._28_4_ = bVar62 * uVar136 | !bVar62 * auVar125._28_4_;
            auVar88 = vblendmps_avx512vl(auVar256,auVar237);
            bVar62 = (bool)((byte)(uVar21 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar21 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar21 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar21 >> 6) & 1);
            bVar15 = SUB81(uVar21 >> 7,0);
            auVar126._0_4_ =
                 (uint)(bVar59 & 1) *
                 ((uint)(bVar56 & 1) * auVar88._0_4_ | !(bool)(bVar56 & 1) * uVar64) |
                 !(bool)(bVar59 & 1) * auVar126._0_4_;
            bVar9 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar126._4_4_ =
                 (uint)bVar9 * ((uint)bVar62 * auVar88._4_4_ | !bVar62 * uVar130) |
                 !bVar9 * auVar126._4_4_;
            bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar126._8_4_ =
                 (uint)bVar62 * ((uint)bVar10 * auVar88._8_4_ | !bVar10 * uVar131) |
                 !bVar62 * auVar126._8_4_;
            bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar126._12_4_ =
                 (uint)bVar62 * ((uint)bVar11 * auVar88._12_4_ | !bVar11 * uVar132) |
                 !bVar62 * auVar126._12_4_;
            bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar126._16_4_ =
                 (uint)bVar62 * ((uint)bVar12 * auVar88._16_4_ | !bVar12 * uVar133) |
                 !bVar62 * auVar126._16_4_;
            bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar126._20_4_ =
                 (uint)bVar62 * ((uint)bVar13 * auVar88._20_4_ | !bVar13 * uVar134) |
                 !bVar62 * auVar126._20_4_;
            bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar126._24_4_ =
                 (uint)bVar62 * ((uint)bVar14 * auVar88._24_4_ | !bVar14 * uVar135) |
                 !bVar62 * auVar126._24_4_;
            bVar62 = SUB81(uVar63 >> 7,0);
            auVar126._28_4_ =
                 (uint)bVar62 * ((uint)bVar15 * auVar88._28_4_ | !bVar15 * uVar136) |
                 !bVar62 * auVar126._28_4_;
            bVar60 = (~bVar59 | bVar56) & bVar60;
          }
        }
        auVar270 = ZEXT3264(local_7c0);
        auVar88 = vmovdqa64_avx512vl(local_7e0);
        auVar264 = ZEXT3264(auVar88);
        auVar265 = ZEXT3264(local_800);
        auVar266 = ZEXT3264(local_820);
        auVar267 = ZEXT3264(local_840);
        auVar268 = ZEXT3264(local_860);
        auVar269 = ZEXT3264(local_880);
        auVar271 = ZEXT3264(local_8a0);
        uVar138 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar234._4_4_ = uVar138;
        auVar234._0_4_ = uVar138;
        auVar234._8_4_ = uVar138;
        auVar234._12_4_ = uVar138;
        auVar234._16_4_ = uVar138;
        auVar234._20_4_ = uVar138;
        auVar234._24_4_ = uVar138;
        auVar234._28_4_ = uVar138;
        uVar138 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar238._4_4_ = uVar138;
        auVar238._0_4_ = uVar138;
        auVar238._8_4_ = uVar138;
        auVar238._12_4_ = uVar138;
        auVar238._16_4_ = uVar138;
        auVar238._20_4_ = uVar138;
        auVar238._24_4_ = uVar138;
        auVar238._28_4_ = uVar138;
        auVar239 = ZEXT3264(auVar238);
        fVar200 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar257 = ZEXT3264(CONCAT428(fVar200,CONCAT424(fVar200,CONCAT420(fVar200,CONCAT416(fVar200,
                                                  CONCAT412(fVar200,CONCAT48(fVar200,CONCAT44(
                                                  fVar200,fVar200))))))));
        auVar231._0_4_ = fVar200 * auVar260._0_4_;
        auVar231._4_4_ = fVar200 * auVar260._4_4_;
        auVar231._8_4_ = fVar200 * auVar260._8_4_;
        auVar231._12_4_ = fVar200 * auVar260._12_4_;
        auVar231._16_4_ = fVar200 * auVar260._16_4_;
        auVar231._20_4_ = fVar200 * auVar260._20_4_;
        auVar231._28_36_ = auVar260._28_36_;
        auVar231._24_4_ = fVar200 * auVar260._24_4_;
        auVar79 = vfmadd231ps_fma(auVar231._0_32_,auVar238,auVar91);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar234,auVar103);
        auVar260 = ZEXT3264(local_400);
        _local_320 = local_400;
        local_300 = vminps_avx(local_2c0,auVar125);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar253 = ZEXT3264(auVar252);
        auVar91 = vandps_avx(auVar252,ZEXT1632(auVar79));
        _local_2e0 = vmaxps_avx(local_400,auVar126);
        auVar230._8_4_ = 0x3e99999a;
        auVar230._0_8_ = 0x3e99999a3e99999a;
        auVar230._12_4_ = 0x3e99999a;
        auVar230._16_4_ = 0x3e99999a;
        auVar230._20_4_ = 0x3e99999a;
        auVar230._24_4_ = 0x3e99999a;
        auVar230._28_4_ = 0x3e99999a;
        auVar231 = ZEXT3264(auVar230);
        uVar20 = vcmpps_avx512vl(auVar91,auVar230,1);
        uVar23 = vcmpps_avx512vl(local_400,local_300,2);
        bVar59 = (byte)uVar23 & bVar55;
        uVar22 = vcmpps_avx512vl(_local_2e0,local_2c0,2);
        if ((bVar55 & ((byte)uVar22 | (byte)uVar23)) != 0) {
          _local_3c0 = _local_2e0;
          local_728 = (uint)(byte)((byte)uVar20 | ~bVar60);
          auVar48._4_4_ = auVar248._4_4_ * fVar200;
          auVar48._0_4_ = auVar248._0_4_ * fVar200;
          auVar48._8_4_ = auVar248._8_4_ * fVar200;
          auVar48._12_4_ = auVar248._12_4_ * fVar200;
          auVar48._16_4_ = auVar248._16_4_ * fVar200;
          auVar48._20_4_ = auVar248._20_4_ * fVar200;
          auVar48._24_4_ = auVar248._24_4_ * fVar200;
          auVar48._28_4_ = local_2e0._28_4_;
          auVar79 = vfmadd213ps_fma(auVar108,auVar238,auVar48);
          auVar79 = vfmadd213ps_fma(auVar107,auVar234,ZEXT1632(auVar79));
          auVar91 = vandps_avx(auVar252,ZEXT1632(auVar79));
          uVar20 = vcmpps_avx512vl(auVar91,auVar230,1);
          bVar60 = (byte)uVar20 | ~bVar60;
          auVar152._8_4_ = 2;
          auVar152._0_8_ = 0x200000002;
          auVar152._12_4_ = 2;
          auVar152._16_4_ = 2;
          auVar152._20_4_ = 2;
          auVar152._24_4_ = 2;
          auVar152._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar152,auVar33);
          local_2a0._0_4_ = (uint)(bVar60 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
          bVar62 = (bool)(bVar60 >> 1 & 1);
          local_2a0._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 2 & 1);
          local_2a0._8_4_ = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 3 & 1);
          local_2a0._12_4_ = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 4 & 1);
          local_2a0._16_4_ = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 5 & 1);
          local_2a0._20_4_ = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 6 & 1);
          local_2a0._24_4_ = (uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * 2;
          local_2a0._28_4_ = (uint)(bVar60 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
          local_360 = vpbroadcastd_avx512vl();
          uVar20 = vpcmpd_avx512vl(local_360,local_2a0,5);
          local_724 = (uint)bVar59;
          local_3a0 = local_400._0_4_ + (float)local_3e0._0_4_;
          fStack_39c = local_400._4_4_ + (float)local_3e0._4_4_;
          fStack_398 = local_400._8_4_ + fStack_3d8;
          fStack_394 = local_400._12_4_ + fStack_3d4;
          fStack_390 = local_400._16_4_ + fStack_3d0;
          fStack_38c = local_400._20_4_ + fStack_3cc;
          fStack_388 = local_400._24_4_ + fStack_3c8;
          fStack_384 = local_400._28_4_ + fStack_3c4;
          _local_540 = auVar113;
          for (bVar59 = (byte)uVar20 & bVar59; auVar91 = local_8c0, bVar59 != 0;
              bVar59 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar59 & (byte)uVar20) {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar153,local_400);
            auVar127._0_4_ =
                 (uint)(bVar59 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar62 * auVar88._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar62 * auVar88._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar62 * auVar88._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar62 * auVar88._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar62 * auVar88._20_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar59 >> 6 & 1);
            auVar127._24_4_ = (uint)bVar62 * auVar88._24_4_ | (uint)!bVar62 * 0x7f800000;
            auVar127._28_4_ =
                 (uint)(bVar59 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar88 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar88 = vminps_avx(auVar127,auVar88);
            auVar89 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar89);
            auVar89 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar89);
            uVar20 = vcmpps_avx512vl(auVar127,auVar88,0);
            bVar56 = (byte)uVar20 & bVar59;
            bVar60 = bVar59;
            if (bVar56 != 0) {
              bVar60 = bVar56;
            }
            iVar24 = 0;
            for (uVar64 = (uint)bVar60; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            auVar239 = ZEXT464(*(uint *)(local_320 + (uint)(iVar24 << 2)));
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_520._0_16_ = (undefined1  [16])aVar2;
            auVar79 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar79._0_4_ < 0.0) {
              local_8c0[1] = 0;
              local_8c0[0] = bVar59;
              local_8c0._2_30_ = auVar91._2_30_;
              local_640._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar24 << 2)));
              local_6a0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar24 << 2)));
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar253 = ZEXT1664(auVar253._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar260 = ZEXT1664(auVar260._0_16_);
              fVar200 = sqrtf(auVar79._0_4_);
              auVar239 = ZEXT1664(local_6a0._0_16_);
              bVar59 = local_8c0[0];
              auVar276 = ZEXT3264(local_7a0);
              auVar275 = ZEXT3264(local_720);
              auVar274 = ZEXT3264(local_700);
              auVar273 = ZEXT3264(local_6e0);
              auVar271 = ZEXT3264(local_8a0);
              auVar269 = ZEXT3264(local_880);
              auVar268 = ZEXT3264(local_860);
              auVar267 = ZEXT3264(local_840);
              auVar266 = ZEXT3264(local_820);
              auVar265 = ZEXT3264(local_800);
              auVar91 = vmovdqa64_avx512vl(local_7e0);
              auVar264 = ZEXT3264(auVar91);
              auVar270 = ZEXT3264(local_7c0);
              auVar272 = ZEXT3264(local_6c0);
              auVar79 = local_640._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar200 = auVar79._0_4_;
              auVar79 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar24 << 2)));
            }
            auVar81 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar85 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar231 = ZEXT3264(_local_5c0);
            auVar80 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar87 = vminps_avx(auVar81,auVar80);
            auVar81 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar80 = vmaxps_avx(auVar85,auVar81);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar87,auVar202);
            auVar81 = vandps_avx(auVar80,auVar202);
            auVar85 = vmaxps_avx(auVar85,auVar81);
            auVar81 = vmovshdup_avx(auVar85);
            auVar81 = vmaxss_avx(auVar81,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar81);
            fVar240 = auVar85._0_4_ * 1.9073486e-06;
            local_4f0 = vshufps_avx(auVar80,auVar80,0xff);
            auVar79 = vinsertps_avx(auVar239._0_16_,auVar79,0x10);
            auVar248 = ZEXT1664(auVar79);
            lVar57 = 5;
            do {
              do {
                bVar62 = lVar57 == 0;
                lVar57 = lVar57 + -1;
                if (bVar62) goto LAB_018caee8;
                uVar138 = auVar248._0_4_;
                auVar142._4_4_ = uVar138;
                auVar142._0_4_ = uVar138;
                auVar142._8_4_ = uVar138;
                auVar142._12_4_ = uVar138;
                auVar79 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_520._0_16_);
                _local_540 = auVar248._0_16_;
                auVar85 = vmovshdup_avx(auVar248._0_16_);
                fVar218 = auVar85._0_4_;
                fVar263 = 1.0 - fVar218;
                fVar247 = fVar263 * fVar263 * fVar263;
                fVar245 = fVar218 * fVar218;
                fVar262 = fVar218 * fVar245;
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                          ZEXT416((uint)fVar262));
                fVar246 = fVar218 * fVar263;
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar246 * 6.0)),
                                          ZEXT416((uint)(fVar263 * fVar246)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                          ZEXT416((uint)fVar247));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar246 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar218 * fVar246)));
                fVar247 = fVar247 * 0.16666667;
                fVar218 = (auVar81._0_4_ + auVar87._0_4_) * 0.16666667;
                fVar219 = (auVar80._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar262 = fVar262 * 0.16666667;
                auVar183._0_4_ = fVar262 * (float)local_5c0._0_4_;
                auVar183._4_4_ = fVar262 * (float)local_5c0._4_4_;
                auVar183._8_4_ = fVar262 * fStack_5b8;
                auVar183._12_4_ = fVar262 * fStack_5b4;
                auVar221._4_4_ = fVar219;
                auVar221._0_4_ = fVar219;
                auVar221._8_4_ = fVar219;
                auVar221._12_4_ = fVar219;
                auVar81 = vfmadd132ps_fma(auVar221,auVar183,local_580._0_16_);
                auVar184._4_4_ = fVar218;
                auVar184._0_4_ = fVar218;
                auVar184._8_4_ = fVar218;
                auVar184._12_4_ = fVar218;
                auVar81 = vfmadd132ps_fma(auVar184,auVar81,local_5a0._0_16_);
                auVar165._4_4_ = fVar247;
                auVar165._0_4_ = fVar247;
                auVar165._8_4_ = fVar247;
                auVar165._12_4_ = fVar247;
                auVar81 = vfmadd132ps_fma(auVar165,auVar81,local_560._0_16_);
                local_440._0_16_ = auVar81;
                auVar81 = vsubps_avx(auVar79,auVar81);
                auVar79 = vdpps_avx(auVar81,auVar81,0x7f);
                local_6a0._0_16_ = auVar81;
                local_5e0._0_16_ = auVar79;
                local_8c0._0_16_ = auVar85;
                local_640._0_16_ = ZEXT416((uint)fVar263);
                if (auVar79._0_4_ < 0.0) {
                  local_660._0_4_ = fVar245;
                  local_680._0_4_ = fVar246;
                  auVar260._0_4_ = sqrtf(auVar79._0_4_);
                  auVar260._4_60_ = extraout_var;
                  auVar79 = auVar260._0_16_;
                  fVar246 = (float)local_680._0_4_;
                  auVar85 = local_8c0._0_16_;
                  auVar81 = local_640._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar79,auVar79);
                  local_660._0_4_ = fVar245;
                  auVar81 = ZEXT416((uint)fVar263);
                }
                local_460._4_4_ = auVar81._0_4_;
                local_460._0_4_ = local_460._4_4_;
                fStack_458 = (float)local_460._4_4_;
                fStack_454 = (float)local_460._4_4_;
                auVar80 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar246 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * 4.0)),auVar81,auVar81);
                fVar245 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
                fVar246 = auVar80._0_4_ * 0.5;
                fVar247 = auVar85._0_4_ * 0.5;
                local_660._0_4_ = (float)local_660._0_4_ * 0.5;
                auVar203._0_4_ = (float)local_660._0_4_ * (float)local_5c0._0_4_;
                auVar203._4_4_ = (float)local_660._0_4_ * (float)local_5c0._4_4_;
                auVar203._8_4_ = (float)local_660._0_4_ * fStack_5b8;
                auVar203._12_4_ = (float)local_660._0_4_ * fStack_5b4;
                auVar166._4_4_ = fVar247;
                auVar166._0_4_ = fVar247;
                auVar166._8_4_ = fVar247;
                auVar166._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar166,auVar203,local_580._0_16_);
                auVar185._4_4_ = fVar246;
                auVar185._0_4_ = fVar246;
                auVar185._8_4_ = fVar246;
                auVar185._12_4_ = fVar246;
                auVar85 = vfmadd132ps_fma(auVar185,auVar85,local_5a0._0_16_);
                auVar258._4_4_ = fVar245;
                auVar258._0_4_ = fVar245;
                auVar258._8_4_ = fVar245;
                auVar258._12_4_ = fVar245;
                local_660._0_16_ = vfmadd132ps_fma(auVar258,auVar85,local_560._0_16_);
                local_480._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
                auVar49._12_4_ = 0;
                auVar49._0_12_ = ZEXT812(0);
                fVar245 = local_480._0_4_;
                _local_770 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar245));
                fVar246 = local_770._0_4_;
                local_4a0._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar245));
                auVar85 = vfnmadd213ss_fma(local_4a0._0_16_,local_480._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar79._0_4_;
                if (fVar245 < -fVar245) {
                  local_780._0_4_ = fVar245 * -0.5;
                  fVar247 = sqrtf(fVar245);
                  auVar79 = ZEXT416((uint)local_680._0_4_);
                  fVar245 = (float)local_780._0_4_;
                  auVar81 = local_660._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
                  fVar247 = auVar81._0_4_;
                  fVar245 = fVar245 * -0.5;
                  auVar81 = local_660._0_16_;
                }
                fVar218 = local_770._0_4_;
                fVar245 = fVar246 * 1.5 + fVar245 * fVar218 * fVar218 * fVar218;
                local_770._0_4_ = auVar81._0_4_ * fVar245;
                local_770._4_4_ = auVar81._4_4_ * fVar245;
                fStack_768 = auVar81._8_4_ * fVar245;
                fStack_764 = auVar81._12_4_ * fVar245;
                auVar80 = vdpps_avx(local_6a0._0_16_,_local_770,0x7f);
                fVar218 = auVar79._0_4_;
                auVar143._0_4_ = auVar80._0_4_ * auVar80._0_4_;
                auVar143._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar143._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar143._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar87 = vsubps_avx(local_5e0._0_16_,auVar143);
                fVar246 = auVar87._0_4_;
                auVar167._4_12_ = ZEXT812(0) << 0x20;
                auVar167._0_4_ = fVar246;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
                auVar75 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                auVar70 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar246 < 0.0) {
                  local_4d0._0_4_ = auVar70._0_4_;
                  local_780 = auVar80;
                  local_4e0 = fVar245;
                  fStack_4dc = fVar245;
                  fStack_4d8 = fVar245;
                  fStack_4d4 = fVar245;
                  local_4c0 = auVar86;
                  fVar246 = sqrtf(fVar246);
                  auVar70 = ZEXT416((uint)local_4d0._0_4_);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar79 = ZEXT416((uint)local_680._0_4_);
                  auVar86 = local_4c0;
                  auVar81 = local_660._0_16_;
                  auVar80 = local_780;
                  fVar245 = local_4e0;
                  fVar219 = fStack_4dc;
                  fVar262 = fStack_4d8;
                  fVar263 = fStack_4d4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar246 = auVar87._0_4_;
                  fVar219 = fVar245;
                  fVar262 = fVar245;
                  fVar263 = fVar245;
                }
                auVar260 = ZEXT1664(auVar81);
                auVar257 = ZEXT1664(local_5e0._0_16_);
                auVar253 = ZEXT1664(local_6a0._0_16_);
                auVar272 = ZEXT3264(local_6c0);
                auVar270 = ZEXT3264(local_7c0);
                auVar91 = vmovdqa64_avx512vl(local_7e0);
                auVar264 = ZEXT3264(auVar91);
                auVar265 = ZEXT3264(local_800);
                auVar266 = ZEXT3264(local_820);
                auVar267 = ZEXT3264(local_840);
                auVar268 = ZEXT3264(local_860);
                auVar269 = ZEXT3264(local_880);
                auVar271 = ZEXT3264(local_8a0);
                auVar273 = ZEXT3264(local_6e0);
                auVar274 = ZEXT3264(local_700);
                auVar275 = ZEXT3264(local_720);
                auVar276 = ZEXT3264(local_7a0);
                auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640._0_16_,
                                          local_8c0._0_16_);
                auVar72 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                          local_640._0_16_);
                auVar87 = vshufps_avx(_local_540,_local_540,0x55);
                auVar186._0_4_ = auVar87._0_4_ * (float)local_5c0._0_4_;
                auVar186._4_4_ = auVar87._4_4_ * (float)local_5c0._4_4_;
                auVar186._8_4_ = auVar87._8_4_ * fStack_5b8;
                auVar186._12_4_ = auVar87._12_4_ * fStack_5b4;
                auVar204._0_4_ = auVar72._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar87 = vfmadd132ps_fma(auVar204,auVar186,local_580._0_16_);
                auVar168._0_4_ = auVar71._0_4_;
                auVar168._4_4_ = auVar168._0_4_;
                auVar168._8_4_ = auVar168._0_4_;
                auVar168._12_4_ = auVar168._0_4_;
                auVar87 = vfmadd132ps_fma(auVar168,auVar87,local_5a0._0_16_);
                auVar87 = vfmadd132ps_fma(_local_460,auVar87,local_560._0_16_);
                auVar169._0_4_ = auVar87._0_4_ * (float)local_480._0_4_;
                auVar169._4_4_ = auVar87._4_4_ * (float)local_480._0_4_;
                auVar169._8_4_ = auVar87._8_4_ * (float)local_480._0_4_;
                auVar169._12_4_ = auVar87._12_4_ * (float)local_480._0_4_;
                auVar87 = vdpps_avx(auVar81,auVar87,0x7f);
                fVar181 = auVar87._0_4_;
                auVar187._0_4_ = auVar81._0_4_ * fVar181;
                auVar187._4_4_ = auVar81._4_4_ * fVar181;
                auVar187._8_4_ = auVar81._8_4_ * fVar181;
                auVar187._12_4_ = auVar81._12_4_ * fVar181;
                auVar87 = vsubps_avx(auVar169,auVar187);
                fVar181 = auVar85._0_4_ * (float)local_4a0._0_4_;
                auVar71 = vmaxss_avx(ZEXT416((uint)fVar240),
                                     ZEXT416((uint)(local_540._0_4_ * fVar200 * 1.9073486e-06)));
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar73 = vxorps_avx512vl(auVar81,auVar25);
                auVar188._0_4_ = fVar245 * auVar87._0_4_ * fVar181;
                auVar188._4_4_ = fVar219 * auVar87._4_4_ * fVar181;
                auVar188._8_4_ = fVar262 * auVar87._8_4_ * fVar181;
                auVar188._12_4_ = fVar263 * auVar87._12_4_ * fVar181;
                auVar85 = vdpps_avx(auVar73,_local_770,0x7f);
                auVar87 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar240),auVar71);
                auVar79 = vdpps_avx(local_6a0._0_16_,auVar188,0x7f);
                auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar218 + 1.0)),
                                          ZEXT416((uint)(fVar240 / fVar247)),auVar87);
                fVar245 = auVar85._0_4_ + auVar79._0_4_;
                auVar79 = vdpps_avx(local_520._0_16_,_local_770,0x7f);
                auVar85 = vdpps_avx(local_6a0._0_16_,auVar73,0x7f);
                auVar87 = vmulss_avx512f(auVar70,auVar86);
                auVar70 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar87._0_4_ *
                                                               auVar86._0_4_ * auVar86._0_4_)));
                auVar87 = vdpps_avx(local_6a0._0_16_,local_520._0_16_,0x7f);
                auVar75 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar245));
                auVar87 = vfnmadd231ss_fma(auVar87,auVar80,auVar79);
                auVar85 = vpermilps_avx(local_440._0_16_,0xff);
                fVar246 = fVar246 - auVar85._0_4_;
                auVar86 = vshufps_avx(auVar81,auVar81,0xff);
                auVar85 = vfmsub213ss_fma(auVar75,auVar70,auVar86);
                auVar242._8_4_ = 0x80000000;
                auVar242._0_8_ = 0x8000000080000000;
                auVar242._12_4_ = 0x80000000;
                auVar244 = ZEXT1664(auVar242);
                auVar235._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar235._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar239 = ZEXT1664(auVar235);
                auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar70._0_4_));
                auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar245),auVar87);
                auVar85 = vinsertps_avx(auVar235,auVar87,0x1c);
                auVar228._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar228._8_4_ = auVar79._8_4_ ^ 0x80000000;
                auVar228._12_4_ = auVar79._12_4_ ^ 0x80000000;
                auVar87 = vinsertps_avx(ZEXT416((uint)fVar245),auVar228,0x10);
                auVar205._0_4_ = auVar75._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar79 = vdivps_avx(auVar85,auVar205);
                auVar85 = vdivps_avx(auVar87,auVar205);
                fVar245 = auVar80._0_4_;
                auVar231 = ZEXT1664(CONCAT412(fVar246,CONCAT48(fVar246,CONCAT44(fVar246,fVar246))));
                auVar206._0_4_ = fVar245 * auVar79._0_4_ + fVar246 * auVar85._0_4_;
                auVar206._4_4_ = fVar245 * auVar79._4_4_ + fVar246 * auVar85._4_4_;
                auVar206._8_4_ = fVar245 * auVar79._8_4_ + fVar246 * auVar85._8_4_;
                auVar206._12_4_ = fVar245 * auVar79._12_4_ + fVar246 * auVar85._12_4_;
                auVar79 = vsubps_avx(_local_540,auVar206);
                auVar248 = ZEXT1664(auVar79);
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar80,auVar26);
              } while (auVar72._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ + auVar71._0_4_)),local_4f0,
                                        ZEXT416(0x36000000));
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(ZEXT416((uint)fVar246),auVar27);
            } while (auVar85._0_4_ <= auVar80._0_4_);
            fVar200 = auVar79._0_4_ + (float)local_500._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar200) &&
               (fVar240 = (ray->super_RayK<1>).tfar, fVar200 <= fVar240)) {
              auVar85 = vmovshdup_avx(auVar79);
              fVar245 = auVar85._0_4_;
              if ((0.0 <= fVar245) && (fVar245 <= 1.0)) {
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                fVar247 = auVar85._0_4_;
                fVar246 = local_5e0._0_4_ * -0.5;
                auVar231 = ZEXT464((uint)fVar246);
                pGVar4 = (context->scene->geometries).items[local_8d0].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar246 = fVar247 * 1.5 + fVar246 * fVar247 * fVar247 * fVar247;
                  auVar207._0_4_ = local_6a0._0_4_ * fVar246;
                  auVar207._4_4_ = local_6a0._4_4_ * fVar246;
                  auVar207._8_4_ = local_6a0._8_4_ * fVar246;
                  auVar207._12_4_ = local_6a0._12_4_ * fVar246;
                  auVar86 = vfmadd213ps_fma(auVar86,auVar207,auVar81);
                  auVar85 = vshufps_avx(auVar207,auVar207,0xc9);
                  auVar80 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar208._0_4_ = auVar207._0_4_ * auVar80._0_4_;
                  auVar208._4_4_ = auVar207._4_4_ * auVar80._4_4_;
                  auVar208._8_4_ = auVar207._8_4_ * auVar80._8_4_;
                  auVar208._12_4_ = auVar207._12_4_ * auVar80._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar208,auVar81,auVar85);
                  auVar85 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar80 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar231 = ZEXT1664(auVar80);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar144._0_4_ = auVar86._0_4_ * auVar87._0_4_;
                  auVar144._4_4_ = auVar86._4_4_ * auVar87._4_4_;
                  auVar144._8_4_ = auVar86._8_4_ * auVar87._8_4_;
                  auVar144._12_4_ = auVar86._12_4_ * auVar87._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar144,auVar85,auVar80);
                  auVar85 = vshufps_avx(auVar87,auVar87,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar200;
                    uVar20 = vmovlps_avx(auVar85);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                    (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                    ray->u = fVar245;
                    ray->v = 0.0;
                    ray->primID = (uint)local_8c8;
                    ray->geomID = (uint)local_8d0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_8c0._0_4_ = fVar240;
                    local_620 = vmovlps_avx(auVar85);
                    local_618 = auVar87._0_4_;
                    local_614 = fVar245;
                    local_610 = 0;
                    local_60c = (uint)local_8c8;
                    local_608 = (uint)local_8d0;
                    local_604 = context->user->instID[0];
                    local_600 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar200;
                    local_8d4 = -1;
                    local_758.valid = &local_8d4;
                    local_758.geometryUserPtr = pGVar4->userPtr;
                    local_758.context = context->user;
                    local_758.ray = (RTCRayN *)ray;
                    local_758.hit = (RTCHitN *)&local_620;
                    local_758.N = 1;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018cb053:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar231 = ZEXT1664(auVar231._0_16_);
                        auVar239 = ZEXT1664(auVar239._0_16_);
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        (*p_Var8)(&local_758);
                        auVar276 = ZEXT3264(local_7a0);
                        auVar275 = ZEXT3264(local_720);
                        auVar274 = ZEXT3264(local_700);
                        auVar273 = ZEXT3264(local_6e0);
                        auVar271 = ZEXT3264(local_8a0);
                        auVar269 = ZEXT3264(local_880);
                        auVar268 = ZEXT3264(local_860);
                        auVar267 = ZEXT3264(local_840);
                        auVar266 = ZEXT3264(local_820);
                        auVar265 = ZEXT3264(local_800);
                        auVar91 = vmovdqa64_avx512vl(local_7e0);
                        auVar264 = ZEXT3264(auVar91);
                        auVar270 = ZEXT3264(local_7c0);
                        auVar272 = ZEXT3264(local_6c0);
                        if (*local_758.valid == 0) goto LAB_018cb15a;
                      }
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).components[0] =
                           *(float *)local_758.hit;
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_758.hit + 4);
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_758.hit + 8);
                      *(float *)((long)local_758.ray + 0x3c) = *(float *)(local_758.hit + 0xc);
                      *(float *)((long)local_758.ray + 0x40) = *(float *)(local_758.hit + 0x10);
                      *(float *)((long)local_758.ray + 0x44) = *(float *)(local_758.hit + 0x14);
                      *(float *)((long)local_758.ray + 0x48) = *(float *)(local_758.hit + 0x18);
                      *(float *)((long)local_758.ray + 0x4c) = *(float *)(local_758.hit + 0x1c);
                      *(float *)((long)local_758.ray + 0x50) = *(float *)(local_758.hit + 0x20);
                    }
                    else {
                      auVar231 = ZEXT1664(auVar80);
                      auVar239 = ZEXT1664(auVar235);
                      auVar244 = ZEXT1664(auVar242);
                      auVar248 = ZEXT1664(auVar79);
                      auVar253 = ZEXT1664(local_6a0._0_16_);
                      auVar257 = ZEXT1664(local_5e0._0_16_);
                      auVar260 = ZEXT1664(auVar81);
                      (*pGVar4->intersectionFilterN)(&local_758);
                      auVar276 = ZEXT3264(local_7a0);
                      auVar275 = ZEXT3264(local_720);
                      auVar274 = ZEXT3264(local_700);
                      auVar273 = ZEXT3264(local_6e0);
                      auVar271 = ZEXT3264(local_8a0);
                      auVar269 = ZEXT3264(local_880);
                      auVar268 = ZEXT3264(local_860);
                      auVar267 = ZEXT3264(local_840);
                      auVar266 = ZEXT3264(local_820);
                      auVar265 = ZEXT3264(local_800);
                      auVar91 = vmovdqa64_avx512vl(local_7e0);
                      auVar264 = ZEXT3264(auVar91);
                      auVar270 = ZEXT3264(local_7c0);
                      auVar272 = ZEXT3264(local_6c0);
                      if (*local_758.valid != 0) goto LAB_018cb053;
LAB_018cb15a:
                      (ray->super_RayK<1>).tfar = (float)local_8c0._0_4_;
                    }
                  }
                }
              }
            }
LAB_018caee8:
            auVar53._4_4_ = fStack_39c;
            auVar53._0_4_ = local_3a0;
            auVar53._8_4_ = fStack_398;
            auVar53._12_4_ = fStack_394;
            auVar53._16_4_ = fStack_390;
            auVar53._20_4_ = fStack_38c;
            auVar53._24_4_ = fStack_388;
            auVar53._28_4_ = fStack_384;
            fVar200 = (ray->super_RayK<1>).tfar;
            auVar34._4_4_ = fVar200;
            auVar34._0_4_ = fVar200;
            auVar34._8_4_ = fVar200;
            auVar34._12_4_ = fVar200;
            auVar34._16_4_ = fVar200;
            auVar34._20_4_ = fVar200;
            auVar34._24_4_ = fVar200;
            auVar34._28_4_ = fVar200;
            uVar20 = vcmpps_avx512vl(auVar53,auVar34,2);
          }
          auVar175._0_4_ = (float)local_3e0._0_4_ + (float)local_3c0._0_4_;
          auVar175._4_4_ = (float)local_3e0._4_4_ + (float)local_3c0._4_4_;
          auVar175._8_4_ = fStack_3d8 + fStack_3b8;
          auVar175._12_4_ = fStack_3d4 + fStack_3b4;
          auVar175._16_4_ = fStack_3d0 + fStack_3b0;
          auVar175._20_4_ = fStack_3cc + fStack_3ac;
          auVar175._24_4_ = fStack_3c8 + fStack_3a8;
          auVar175._28_4_ = fStack_3c4 + fStack_3a4;
          fVar240 = (ray->super_RayK<1>).tfar;
          fVar200 = (ray->super_RayK<1>).tfar;
          auVar35._4_4_ = fVar200;
          auVar35._0_4_ = fVar200;
          auVar35._8_4_ = fVar200;
          auVar35._12_4_ = fVar200;
          auVar35._16_4_ = fVar200;
          auVar35._20_4_ = fVar200;
          auVar35._24_4_ = fVar200;
          auVar35._28_4_ = fVar200;
          uVar20 = vcmpps_avx512vl(auVar175,auVar35,2);
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar176,auVar36);
          bVar62 = (bool)((byte)local_728 & 1);
          local_3c0._0_4_ = (uint)bVar62 * auVar91._0_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)((byte)(local_728 >> 1) & 1);
          local_3c0._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)((byte)(local_728 >> 2) & 1);
          fStack_3b8 = (float)((uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_728 >> 3) & 1);
          fStack_3b4 = (float)((uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_728 >> 4) & 1);
          fStack_3b0 = (float)((uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_728 >> 5) & 1);
          fStack_3ac = (float)((uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_728 >> 6) & 1);
          fStack_3a8 = (float)((uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)((byte)(local_728 >> 7) & 1);
          fStack_3a4 = (float)((uint)bVar62 * auVar91._28_4_ | (uint)!bVar62 * 2);
          bVar55 = (byte)uVar22 & bVar55 & (byte)uVar20;
          uVar20 = vpcmpd_avx512vl(_local_3c0,local_360,2);
          local_400 = _local_2e0;
          local_3a0 = (float)local_3e0._0_4_ + (float)local_2e0._0_4_;
          fStack_39c = (float)local_3e0._4_4_ + (float)local_2e0._4_4_;
          fStack_398 = fStack_3d8 + fStack_2d8;
          fStack_394 = fStack_3d4 + fStack_2d4;
          fStack_390 = fStack_3d0 + fStack_2d0;
          fStack_38c = fStack_3cc + fStack_2cc;
          fStack_388 = fStack_3c8 + fStack_2c8;
          fStack_384 = fStack_3c4 + fStack_2c4;
          for (bVar60 = (byte)uVar20 & bVar55; auVar91 = local_8c0, bVar60 != 0;
              bVar60 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar60 & (byte)uVar20) {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar154,local_400);
            auVar128._0_4_ =
                 (uint)(bVar60 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar62 * auVar88._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar62 * auVar88._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar62 * auVar88._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar62 * auVar88._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar62 * auVar88._20_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 6 & 1);
            auVar128._24_4_ = (uint)bVar62 * auVar88._24_4_ | (uint)!bVar62 * 0x7f800000;
            auVar128._28_4_ =
                 (uint)(bVar60 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar60 >> 7) * 0x7f800000;
            auVar88 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar88 = vminps_avx(auVar128,auVar88);
            auVar89 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar89);
            auVar89 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar89);
            uVar20 = vcmpps_avx512vl(auVar128,auVar88,0);
            bVar56 = (byte)uVar20 & bVar60;
            bVar59 = bVar60;
            if (bVar56 != 0) {
              bVar59 = bVar56;
            }
            iVar24 = 0;
            for (uVar64 = (uint)bVar59; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            auVar239 = ZEXT464(*(uint *)(local_2c0 + (uint)(iVar24 << 2)));
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_520._0_16_ = (undefined1  [16])aVar2;
            auVar79 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar79._0_4_ < 0.0) {
              local_8c0[1] = 0;
              local_8c0[0] = bVar60;
              local_8c0._2_30_ = auVar91._2_30_;
              local_640._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar24 << 2)));
              local_6a0._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar24 << 2)));
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar253 = ZEXT1664(auVar253._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar260 = ZEXT1664(auVar260._0_16_);
              fVar200 = sqrtf(auVar79._0_4_);
              auVar239 = ZEXT1664(local_6a0._0_16_);
              bVar60 = local_8c0[0];
              auVar276 = ZEXT3264(local_7a0);
              auVar275 = ZEXT3264(local_720);
              auVar274 = ZEXT3264(local_700);
              auVar273 = ZEXT3264(local_6e0);
              auVar271 = ZEXT3264(local_8a0);
              auVar269 = ZEXT3264(local_880);
              auVar268 = ZEXT3264(local_860);
              auVar267 = ZEXT3264(local_840);
              auVar266 = ZEXT3264(local_820);
              auVar265 = ZEXT3264(local_800);
              auVar91 = vmovdqa64_avx512vl(local_7e0);
              auVar264 = ZEXT3264(auVar91);
              auVar270 = ZEXT3264(local_7c0);
              auVar272 = ZEXT3264(local_6c0);
              auVar79 = local_640._0_16_;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar200 = auVar79._0_4_;
              auVar79 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar24 << 2)));
            }
            auVar81 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar85 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar231 = ZEXT3264(_local_5c0);
            auVar80 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar87 = vminps_avx(auVar81,auVar80);
            auVar81 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar80 = vmaxps_avx(auVar85,auVar81);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar87,auVar209);
            auVar81 = vandps_avx(auVar80,auVar209);
            auVar85 = vmaxps_avx(auVar85,auVar81);
            auVar81 = vmovshdup_avx(auVar85);
            auVar81 = vmaxss_avx(auVar81,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar81);
            fVar240 = auVar85._0_4_ * 1.9073486e-06;
            local_4f0 = vshufps_avx(auVar80,auVar80,0xff);
            auVar79 = vinsertps_avx(auVar239._0_16_,auVar79,0x10);
            auVar248 = ZEXT1664(auVar79);
            lVar57 = 5;
            do {
              do {
                bVar62 = lVar57 == 0;
                lVar57 = lVar57 + -1;
                if (bVar62) goto LAB_018cbb17;
                uVar138 = auVar248._0_4_;
                auVar145._4_4_ = uVar138;
                auVar145._0_4_ = uVar138;
                auVar145._8_4_ = uVar138;
                auVar145._12_4_ = uVar138;
                auVar79 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_520._0_16_);
                _local_540 = auVar248._0_16_;
                auVar85 = vmovshdup_avx(auVar248._0_16_);
                fVar218 = auVar85._0_4_;
                fVar263 = 1.0 - fVar218;
                fVar247 = fVar263 * fVar263 * fVar263;
                fVar245 = fVar218 * fVar218;
                fVar262 = fVar218 * fVar245;
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                          ZEXT416((uint)fVar262));
                fVar246 = fVar218 * fVar263;
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * fVar246 * 6.0)),
                                          ZEXT416((uint)(fVar263 * fVar246)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                          ZEXT416((uint)fVar247));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar263 * fVar246 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar218 * fVar246)));
                fVar247 = fVar247 * 0.16666667;
                fVar218 = (auVar81._0_4_ + auVar87._0_4_) * 0.16666667;
                fVar219 = (auVar80._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar262 = fVar262 * 0.16666667;
                auVar189._0_4_ = fVar262 * (float)local_5c0._0_4_;
                auVar189._4_4_ = fVar262 * (float)local_5c0._4_4_;
                auVar189._8_4_ = fVar262 * fStack_5b8;
                auVar189._12_4_ = fVar262 * fStack_5b4;
                auVar222._4_4_ = fVar219;
                auVar222._0_4_ = fVar219;
                auVar222._8_4_ = fVar219;
                auVar222._12_4_ = fVar219;
                auVar81 = vfmadd132ps_fma(auVar222,auVar189,local_580._0_16_);
                auVar190._4_4_ = fVar218;
                auVar190._0_4_ = fVar218;
                auVar190._8_4_ = fVar218;
                auVar190._12_4_ = fVar218;
                auVar81 = vfmadd132ps_fma(auVar190,auVar81,local_5a0._0_16_);
                auVar170._4_4_ = fVar247;
                auVar170._0_4_ = fVar247;
                auVar170._8_4_ = fVar247;
                auVar170._12_4_ = fVar247;
                auVar81 = vfmadd132ps_fma(auVar170,auVar81,local_560._0_16_);
                local_440._0_16_ = auVar81;
                auVar81 = vsubps_avx(auVar79,auVar81);
                auVar79 = vdpps_avx(auVar81,auVar81,0x7f);
                local_6a0._0_16_ = auVar81;
                local_5e0._0_16_ = auVar79;
                local_8c0._0_16_ = auVar85;
                local_640._0_16_ = ZEXT416((uint)fVar263);
                if (auVar79._0_4_ < 0.0) {
                  local_660._0_4_ = fVar245;
                  local_680._0_4_ = fVar246;
                  auVar257._0_4_ = sqrtf(auVar79._0_4_);
                  auVar257._4_60_ = extraout_var_00;
                  auVar79 = auVar257._0_16_;
                  fVar246 = (float)local_680._0_4_;
                  auVar85 = local_8c0._0_16_;
                  auVar81 = local_640._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar79,auVar79);
                  local_660._0_4_ = fVar245;
                  auVar81 = ZEXT416((uint)fVar263);
                }
                local_460._4_4_ = auVar81._0_4_;
                local_460._0_4_ = local_460._4_4_;
                fStack_458 = (float)local_460._4_4_;
                fStack_454 = (float)local_460._4_4_;
                auVar80 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar246 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * 4.0)),auVar81,auVar81);
                fVar245 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
                fVar246 = auVar80._0_4_ * 0.5;
                fVar247 = auVar85._0_4_ * 0.5;
                local_660._0_4_ = (float)local_660._0_4_ * 0.5;
                auVar210._0_4_ = (float)local_660._0_4_ * (float)local_5c0._0_4_;
                auVar210._4_4_ = (float)local_660._0_4_ * (float)local_5c0._4_4_;
                auVar210._8_4_ = (float)local_660._0_4_ * fStack_5b8;
                auVar210._12_4_ = (float)local_660._0_4_ * fStack_5b4;
                auVar171._4_4_ = fVar247;
                auVar171._0_4_ = fVar247;
                auVar171._8_4_ = fVar247;
                auVar171._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar171,auVar210,local_580._0_16_);
                auVar191._4_4_ = fVar246;
                auVar191._0_4_ = fVar246;
                auVar191._8_4_ = fVar246;
                auVar191._12_4_ = fVar246;
                auVar85 = vfmadd132ps_fma(auVar191,auVar85,local_5a0._0_16_);
                auVar259._4_4_ = fVar245;
                auVar259._0_4_ = fVar245;
                auVar259._8_4_ = fVar245;
                auVar259._12_4_ = fVar245;
                local_660._0_16_ = vfmadd132ps_fma(auVar259,auVar85,local_560._0_16_);
                local_480._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
                auVar50._12_4_ = 0;
                auVar50._0_12_ = ZEXT812(0);
                fVar245 = local_480._0_4_;
                _local_770 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar245));
                fVar246 = local_770._0_4_;
                local_4a0._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar245));
                auVar85 = vfnmadd213ss_fma(local_4a0._0_16_,local_480._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar79._0_4_;
                if (fVar245 < -fVar245) {
                  local_780._0_4_ = fVar245 * -0.5;
                  fVar247 = sqrtf(fVar245);
                  auVar79 = ZEXT416((uint)local_680._0_4_);
                  fVar245 = (float)local_780._0_4_;
                  auVar81 = local_660._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
                  fVar247 = auVar81._0_4_;
                  fVar245 = fVar245 * -0.5;
                  auVar81 = local_660._0_16_;
                }
                fVar218 = local_770._0_4_;
                local_770._4_4_ = fVar246 * 1.5 + fVar245 * fVar218 * fVar218 * fVar218;
                local_770._0_4_ = local_770._4_4_;
                fStack_768 = (float)local_770._4_4_;
                fStack_764 = (float)local_770._4_4_;
                auVar261._0_4_ = auVar81._0_4_ * (float)local_770._4_4_;
                auVar261._4_4_ = auVar81._4_4_ * (float)local_770._4_4_;
                auVar261._8_4_ = auVar81._8_4_ * (float)local_770._4_4_;
                auVar261._12_4_ = auVar81._12_4_ * (float)local_770._4_4_;
                auVar80 = vdpps_avx(local_6a0._0_16_,auVar261,0x7f);
                fVar246 = auVar79._0_4_;
                auVar146._0_4_ = auVar80._0_4_ * auVar80._0_4_;
                auVar146._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar146._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar146._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar87 = vsubps_avx(local_5e0._0_16_,auVar146);
                fVar245 = auVar87._0_4_;
                auVar172._4_12_ = ZEXT812(0) << 0x20;
                auVar172._0_4_ = fVar245;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                auVar75 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                auVar70 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar245 < 0.0) {
                  local_4e0 = auVar70._0_4_;
                  local_780 = auVar80;
                  local_4d0 = auVar261;
                  local_4c0 = auVar86;
                  fVar245 = sqrtf(fVar245);
                  auVar70 = ZEXT416((uint)local_4e0);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar79 = ZEXT416((uint)local_680._0_4_);
                  auVar86 = local_4c0;
                  auVar81 = local_660._0_16_;
                  auVar80 = local_780;
                  auVar261 = local_4d0;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar245 = auVar87._0_4_;
                }
                auVar260 = ZEXT1664(auVar81);
                auVar257 = ZEXT1664(local_5e0._0_16_);
                auVar253 = ZEXT1664(local_6a0._0_16_);
                auVar272 = ZEXT3264(local_6c0);
                auVar270 = ZEXT3264(local_7c0);
                auVar91 = vmovdqa64_avx512vl(local_7e0);
                auVar264 = ZEXT3264(auVar91);
                auVar265 = ZEXT3264(local_800);
                auVar266 = ZEXT3264(local_820);
                auVar267 = ZEXT3264(local_840);
                auVar268 = ZEXT3264(local_860);
                auVar269 = ZEXT3264(local_880);
                auVar271 = ZEXT3264(local_8a0);
                auVar273 = ZEXT3264(local_6e0);
                auVar274 = ZEXT3264(local_700);
                auVar275 = ZEXT3264(local_720);
                auVar276 = ZEXT3264(local_7a0);
                auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640._0_16_,
                                          local_8c0._0_16_);
                auVar72 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                          local_640._0_16_);
                auVar87 = vshufps_avx(_local_540,_local_540,0x55);
                auVar192._0_4_ = auVar87._0_4_ * (float)local_5c0._0_4_;
                auVar192._4_4_ = auVar87._4_4_ * (float)local_5c0._4_4_;
                auVar192._8_4_ = auVar87._8_4_ * fStack_5b8;
                auVar192._12_4_ = auVar87._12_4_ * fStack_5b4;
                auVar211._0_4_ = auVar72._0_4_;
                auVar211._4_4_ = auVar211._0_4_;
                auVar211._8_4_ = auVar211._0_4_;
                auVar211._12_4_ = auVar211._0_4_;
                auVar87 = vfmadd132ps_fma(auVar211,auVar192,local_580._0_16_);
                auVar173._0_4_ = auVar71._0_4_;
                auVar173._4_4_ = auVar173._0_4_;
                auVar173._8_4_ = auVar173._0_4_;
                auVar173._12_4_ = auVar173._0_4_;
                auVar87 = vfmadd132ps_fma(auVar173,auVar87,local_5a0._0_16_);
                auVar87 = vfmadd132ps_fma(_local_460,auVar87,local_560._0_16_);
                auVar174._0_4_ = auVar87._0_4_ * (float)local_480._0_4_;
                auVar174._4_4_ = auVar87._4_4_ * (float)local_480._0_4_;
                auVar174._8_4_ = auVar87._8_4_ * (float)local_480._0_4_;
                auVar174._12_4_ = auVar87._12_4_ * (float)local_480._0_4_;
                auVar87 = vdpps_avx(auVar81,auVar87,0x7f);
                fVar218 = auVar87._0_4_;
                auVar193._0_4_ = auVar81._0_4_ * fVar218;
                auVar193._4_4_ = auVar81._4_4_ * fVar218;
                auVar193._8_4_ = auVar81._8_4_ * fVar218;
                auVar193._12_4_ = auVar81._12_4_ * fVar218;
                auVar87 = vsubps_avx(auVar174,auVar193);
                fVar218 = auVar85._0_4_ * (float)local_4a0._0_4_;
                auVar71 = vmaxss_avx(ZEXT416((uint)fVar240),
                                     ZEXT416((uint)(local_540._0_4_ * fVar200 * 1.9073486e-06)));
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar73 = vxorps_avx512vl(auVar81,auVar28);
                auVar194._0_4_ = auVar87._0_4_ * fVar218 * (float)local_770._0_4_;
                auVar194._4_4_ = auVar87._4_4_ * fVar218 * (float)local_770._4_4_;
                auVar194._8_4_ = auVar87._8_4_ * fVar218 * fStack_768;
                auVar194._12_4_ = auVar87._12_4_ * fVar218 * fStack_764;
                auVar85 = vdpps_avx(auVar73,auVar261,0x7f);
                auVar87 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar240),auVar71);
                auVar79 = vdpps_avx(local_6a0._0_16_,auVar194,0x7f);
                auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar246 + 1.0)),
                                          ZEXT416((uint)(fVar240 / fVar247)),auVar87);
                fVar246 = auVar85._0_4_ + auVar79._0_4_;
                auVar79 = vdpps_avx(local_520._0_16_,auVar261,0x7f);
                auVar85 = vdpps_avx(local_6a0._0_16_,auVar73,0x7f);
                auVar87 = vmulss_avx512f(auVar70,auVar86);
                auVar70 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar87._0_4_ *
                                                               auVar86._0_4_ * auVar86._0_4_)));
                auVar87 = vdpps_avx(local_6a0._0_16_,local_520._0_16_,0x7f);
                auVar75 = vfnmadd231ss_fma(auVar85,auVar80,ZEXT416((uint)fVar246));
                auVar87 = vfnmadd231ss_fma(auVar87,auVar80,auVar79);
                auVar85 = vpermilps_avx(local_440._0_16_,0xff);
                fVar245 = fVar245 - auVar85._0_4_;
                auVar86 = vshufps_avx(auVar81,auVar81,0xff);
                auVar85 = vfmsub213ss_fma(auVar75,auVar70,auVar86);
                auVar243._8_4_ = 0x80000000;
                auVar243._0_8_ = 0x8000000080000000;
                auVar243._12_4_ = 0x80000000;
                auVar244 = ZEXT1664(auVar243);
                auVar236._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar236._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar239 = ZEXT1664(auVar236);
                auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar70._0_4_));
                auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar246),auVar87);
                auVar85 = vinsertps_avx(auVar236,auVar87,0x1c);
                auVar229._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = auVar79._8_4_ ^ 0x80000000;
                auVar229._12_4_ = auVar79._12_4_ ^ 0x80000000;
                auVar87 = vinsertps_avx(ZEXT416((uint)fVar246),auVar229,0x10);
                auVar212._0_4_ = auVar75._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar79 = vdivps_avx(auVar85,auVar212);
                auVar85 = vdivps_avx(auVar87,auVar212);
                fVar246 = auVar80._0_4_;
                auVar231 = ZEXT1664(CONCAT412(fVar245,CONCAT48(fVar245,CONCAT44(fVar245,fVar245))));
                auVar213._0_4_ = fVar246 * auVar79._0_4_ + fVar245 * auVar85._0_4_;
                auVar213._4_4_ = fVar246 * auVar79._4_4_ + fVar245 * auVar85._4_4_;
                auVar213._8_4_ = fVar246 * auVar79._8_4_ + fVar245 * auVar85._8_4_;
                auVar213._12_4_ = fVar246 * auVar79._12_4_ + fVar245 * auVar85._12_4_;
                auVar79 = vsubps_avx(_local_540,auVar213);
                auVar248 = ZEXT1664(auVar79);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar80,auVar29);
              } while (auVar72._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ + auVar71._0_4_)),local_4f0,
                                        ZEXT416(0x36000000));
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(ZEXT416((uint)fVar245),auVar30);
            } while (auVar85._0_4_ <= auVar80._0_4_);
            fVar200 = auVar79._0_4_ + (float)local_500._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar200) &&
               (fVar240 = (ray->super_RayK<1>).tfar, fVar200 <= fVar240)) {
              auVar85 = vmovshdup_avx(auVar79);
              fVar245 = auVar85._0_4_;
              if ((0.0 <= fVar245) && (fVar245 <= 1.0)) {
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                fVar247 = auVar85._0_4_;
                fVar246 = local_5e0._0_4_ * -0.5;
                auVar231 = ZEXT464((uint)fVar246);
                pGVar4 = (context->scene->geometries).items[local_8d0].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar246 = fVar247 * 1.5 + fVar246 * fVar247 * fVar247 * fVar247;
                  auVar214._0_4_ = local_6a0._0_4_ * fVar246;
                  auVar214._4_4_ = local_6a0._4_4_ * fVar246;
                  auVar214._8_4_ = local_6a0._8_4_ * fVar246;
                  auVar214._12_4_ = local_6a0._12_4_ * fVar246;
                  auVar86 = vfmadd213ps_fma(auVar86,auVar214,auVar81);
                  auVar85 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar80 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar215._0_4_ = auVar214._0_4_ * auVar80._0_4_;
                  auVar215._4_4_ = auVar214._4_4_ * auVar80._4_4_;
                  auVar215._8_4_ = auVar214._8_4_ * auVar80._8_4_;
                  auVar215._12_4_ = auVar214._12_4_ * auVar80._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar215,auVar81,auVar85);
                  auVar85 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar80 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar231 = ZEXT1664(auVar80);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar147._0_4_ = auVar86._0_4_ * auVar87._0_4_;
                  auVar147._4_4_ = auVar86._4_4_ * auVar87._4_4_;
                  auVar147._8_4_ = auVar86._8_4_ * auVar87._8_4_;
                  auVar147._12_4_ = auVar86._12_4_ * auVar87._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar147,auVar85,auVar80);
                  auVar85 = vshufps_avx(auVar87,auVar87,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar200;
                    uVar20 = vmovlps_avx(auVar85);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                    (ray->Ng).field_0.field_0.z = auVar87._0_4_;
                    ray->u = fVar245;
                    ray->v = 0.0;
                    ray->primID = (uint)local_8c8;
                    ray->geomID = (uint)local_8d0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_8c0._0_4_ = fVar240;
                    local_620 = vmovlps_avx(auVar85);
                    local_618 = auVar87._0_4_;
                    local_614 = fVar245;
                    local_610 = 0;
                    local_60c = (uint)local_8c8;
                    local_608 = (uint)local_8d0;
                    local_604 = context->user->instID[0];
                    local_600 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar200;
                    local_8d4 = -1;
                    local_758.valid = &local_8d4;
                    local_758.geometryUserPtr = pGVar4->userPtr;
                    local_758.context = context->user;
                    local_758.ray = (RTCRayN *)ray;
                    local_758.hit = (RTCHitN *)&local_620;
                    local_758.N = 1;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018cbc7f:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar231 = ZEXT1664(auVar231._0_16_);
                        auVar239 = ZEXT1664(auVar239._0_16_);
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        (*p_Var8)(&local_758);
                        auVar276 = ZEXT3264(local_7a0);
                        auVar275 = ZEXT3264(local_720);
                        auVar274 = ZEXT3264(local_700);
                        auVar273 = ZEXT3264(local_6e0);
                        auVar271 = ZEXT3264(local_8a0);
                        auVar269 = ZEXT3264(local_880);
                        auVar268 = ZEXT3264(local_860);
                        auVar267 = ZEXT3264(local_840);
                        auVar266 = ZEXT3264(local_820);
                        auVar265 = ZEXT3264(local_800);
                        auVar91 = vmovdqa64_avx512vl(local_7e0);
                        auVar264 = ZEXT3264(auVar91);
                        auVar270 = ZEXT3264(local_7c0);
                        auVar272 = ZEXT3264(local_6c0);
                        if (*local_758.valid == 0) goto LAB_018cbd86;
                      }
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).components[0] =
                           *(float *)local_758.hit;
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_758.hit + 4);
                      (((Vec3f *)((long)local_758.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_758.hit + 8);
                      *(float *)((long)local_758.ray + 0x3c) = *(float *)(local_758.hit + 0xc);
                      *(float *)((long)local_758.ray + 0x40) = *(float *)(local_758.hit + 0x10);
                      *(float *)((long)local_758.ray + 0x44) = *(float *)(local_758.hit + 0x14);
                      *(float *)((long)local_758.ray + 0x48) = *(float *)(local_758.hit + 0x18);
                      *(float *)((long)local_758.ray + 0x4c) = *(float *)(local_758.hit + 0x1c);
                      *(float *)((long)local_758.ray + 0x50) = *(float *)(local_758.hit + 0x20);
                    }
                    else {
                      auVar231 = ZEXT1664(auVar80);
                      auVar239 = ZEXT1664(auVar236);
                      auVar244 = ZEXT1664(auVar243);
                      auVar248 = ZEXT1664(auVar79);
                      auVar253 = ZEXT1664(local_6a0._0_16_);
                      auVar257 = ZEXT1664(local_5e0._0_16_);
                      auVar260 = ZEXT1664(auVar81);
                      (*pGVar4->intersectionFilterN)(&local_758);
                      auVar276 = ZEXT3264(local_7a0);
                      auVar275 = ZEXT3264(local_720);
                      auVar274 = ZEXT3264(local_700);
                      auVar273 = ZEXT3264(local_6e0);
                      auVar271 = ZEXT3264(local_8a0);
                      auVar269 = ZEXT3264(local_880);
                      auVar268 = ZEXT3264(local_860);
                      auVar267 = ZEXT3264(local_840);
                      auVar266 = ZEXT3264(local_820);
                      auVar265 = ZEXT3264(local_800);
                      auVar91 = vmovdqa64_avx512vl(local_7e0);
                      auVar264 = ZEXT3264(auVar91);
                      auVar270 = ZEXT3264(local_7c0);
                      auVar272 = ZEXT3264(local_6c0);
                      if (*local_758.valid != 0) goto LAB_018cbc7f;
LAB_018cbd86:
                      (ray->super_RayK<1>).tfar = (float)local_8c0._0_4_;
                    }
                  }
                }
              }
            }
LAB_018cbb17:
            fVar240 = (ray->super_RayK<1>).tfar;
            auVar54._4_4_ = fStack_39c;
            auVar54._0_4_ = local_3a0;
            auVar54._8_4_ = fStack_398;
            auVar54._12_4_ = fStack_394;
            auVar54._16_4_ = fStack_390;
            auVar54._20_4_ = fStack_38c;
            auVar54._24_4_ = fStack_388;
            auVar54._28_4_ = fStack_384;
            fVar200 = (ray->super_RayK<1>).tfar;
            auVar37._4_4_ = fVar200;
            auVar37._0_4_ = fVar200;
            auVar37._8_4_ = fVar200;
            auVar37._12_4_ = fVar200;
            auVar37._16_4_ = fVar200;
            auVar37._20_4_ = fVar200;
            auVar37._24_4_ = fVar200;
            auVar37._28_4_ = fVar200;
            uVar20 = vcmpps_avx512vl(auVar54,auVar37,2);
          }
          uVar23 = vpcmpd_avx512vl(local_360,local_2a0,1);
          uVar22 = vpcmpd_avx512vl(local_360,_local_3c0,1);
          auVar195._0_4_ = (float)local_3e0._0_4_ + (float)local_320._0_4_;
          auVar195._4_4_ = (float)local_3e0._4_4_ + (float)local_320._4_4_;
          auVar195._8_4_ = fStack_3d8 + fStack_318;
          auVar195._12_4_ = fStack_3d4 + fStack_314;
          auVar195._16_4_ = fStack_3d0 + fStack_310;
          auVar195._20_4_ = fStack_3cc + fStack_30c;
          auVar195._24_4_ = fStack_3c8 + fStack_308;
          auVar195._28_4_ = fStack_3c4 + fStack_304;
          auVar216._4_4_ = fVar240;
          auVar216._0_4_ = fVar240;
          auVar216._8_4_ = fVar240;
          auVar216._12_4_ = fVar240;
          auVar216._16_4_ = fVar240;
          auVar216._20_4_ = fVar240;
          auVar216._24_4_ = fVar240;
          auVar216._28_4_ = fVar240;
          uVar20 = vcmpps_avx512vl(auVar195,auVar216,2);
          bVar60 = (byte)local_724 & (byte)uVar23 & (byte)uVar20;
          auVar196._0_4_ = (float)local_3e0._0_4_ + (float)local_2e0._0_4_;
          auVar196._4_4_ = (float)local_3e0._4_4_ + (float)local_2e0._4_4_;
          auVar196._8_4_ = fStack_3d8 + fStack_2d8;
          auVar196._12_4_ = fStack_3d4 + fStack_2d4;
          auVar196._16_4_ = fStack_3d0 + fStack_2d0;
          auVar196._20_4_ = fStack_3cc + fStack_2cc;
          auVar196._24_4_ = fStack_3c8 + fStack_2c8;
          auVar196._28_4_ = fStack_3c4 + fStack_2c4;
          uVar20 = vcmpps_avx512vl(auVar196,auVar216,2);
          bVar55 = bVar55 & (byte)uVar22 & (byte)uVar20 | bVar60;
          prim = local_5e8;
          if (bVar55 != 0) {
            abStack_180[uVar58 * 0x60] = bVar55;
            bVar62 = (bool)(bVar60 >> 1 & 1);
            bVar9 = (bool)(bVar60 >> 2 & 1);
            bVar10 = (bool)(bVar60 >> 3 & 1);
            bVar11 = (bool)(bVar60 >> 4 & 1);
            bVar12 = (bool)(bVar60 >> 5 & 1);
            bVar13 = (bool)(bVar60 >> 6 & 1);
            auStack_160[uVar58 * 0x18] =
                 (uint)(bVar60 & 1) * local_320._0_4_ | (uint)!(bool)(bVar60 & 1) * local_2e0._0_4_;
            auStack_160[uVar58 * 0x18 + 1] =
                 (uint)bVar62 * local_320._4_4_ | (uint)!bVar62 * local_2e0._4_4_;
            auStack_160[uVar58 * 0x18 + 2] =
                 (uint)bVar9 * (int)fStack_318 | (uint)!bVar9 * (int)fStack_2d8;
            auStack_160[uVar58 * 0x18 + 3] =
                 (uint)bVar10 * (int)fStack_314 | (uint)!bVar10 * (int)fStack_2d4;
            auStack_160[uVar58 * 0x18 + 4] =
                 (uint)bVar11 * (int)fStack_310 | (uint)!bVar11 * (int)fStack_2d0;
            auStack_160[uVar58 * 0x18 + 5] =
                 (uint)bVar12 * (int)fStack_30c | (uint)!bVar12 * (int)fStack_2cc;
            auStack_160[uVar58 * 0x18 + 6] =
                 (uint)bVar13 * (int)fStack_308 | (uint)!bVar13 * (int)fStack_2c8;
            auStack_160[uVar58 * 0x18 + 7] =
                 (uint)(bVar60 >> 7) * (int)fStack_304 |
                 (uint)!(bool)(bVar60 >> 7) * (int)fStack_2c4;
            uVar63 = vmovlps_avx(local_370);
            (&uStack_140)[uVar58 * 0xc] = uVar63;
            aiStack_138[uVar58 * 0x18] = local_8ec + 1;
            uVar58 = (ulong)((int)uVar58 + 1);
          }
        }
      }
    }
    fVar240 = (ray->super_RayK<1>).tfar;
    fVar200 = (ray->super_RayK<1>).tfar;
    auVar177._4_4_ = fVar200;
    auVar177._0_4_ = fVar200;
    auVar177._8_4_ = fVar200;
    auVar177._12_4_ = fVar200;
    auVar177._16_4_ = fVar200;
    auVar177._20_4_ = fVar200;
    auVar177._24_4_ = fVar200;
    auVar177._28_4_ = fVar200;
    do {
      uVar64 = (uint)uVar58;
      uVar58 = (ulong)(uVar64 - 1);
      if (uVar64 == 0) {
        auVar149._4_4_ = fVar240;
        auVar149._0_4_ = fVar240;
        auVar149._8_4_ = fVar240;
        auVar149._12_4_ = fVar240;
        uVar20 = vcmpps_avx512vl(auVar149,local_380,0xd);
        uVar58 = (ulong)((uint)uVar20 & (uint)local_4a8 - 1 & (uint)local_4a8);
        goto LAB_018c9656;
      }
      auVar91 = *(undefined1 (*) [32])(auStack_160 + uVar58 * 0x18);
      auVar217._0_4_ = auVar91._0_4_ + (float)local_3e0._0_4_;
      auVar217._4_4_ = auVar91._4_4_ + (float)local_3e0._4_4_;
      auVar217._8_4_ = auVar91._8_4_ + fStack_3d8;
      auVar217._12_4_ = auVar91._12_4_ + fStack_3d4;
      auVar217._16_4_ = auVar91._16_4_ + fStack_3d0;
      auVar217._20_4_ = auVar91._20_4_ + fStack_3cc;
      auVar217._24_4_ = auVar91._24_4_ + fStack_3c8;
      auVar217._28_4_ = auVar91._28_4_ + fStack_3c4;
      uVar20 = vcmpps_avx512vl(auVar217,auVar177,2);
      uVar130 = (uint)uVar20 & (uint)abStack_180[uVar58 * 0x60];
    } while (uVar130 == 0);
    uVar63 = (&uStack_140)[uVar58 * 0xc];
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar63;
    auVar178._8_4_ = 0x7f800000;
    auVar178._0_8_ = 0x7f8000007f800000;
    auVar178._12_4_ = 0x7f800000;
    auVar178._16_4_ = 0x7f800000;
    auVar178._20_4_ = 0x7f800000;
    auVar178._24_4_ = 0x7f800000;
    auVar178._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar178,auVar91);
    bVar55 = (byte)uVar130;
    auVar129._0_4_ = (uint)(bVar55 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 0x7f800000;
    bVar62 = (bool)((byte)(uVar130 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * 0x7f800000;
    auVar129._28_4_ = (uVar130 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar130 >> 7,0) * 0x7f800000;
    auVar91 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar91 = vminps_avx(auVar129,auVar91);
    auVar88 = vshufpd_avx(auVar91,auVar91,5);
    auVar91 = vminps_avx(auVar91,auVar88);
    auVar88 = vpermpd_avx2(auVar91,0x4e);
    auVar91 = vminps_avx(auVar91,auVar88);
    uVar20 = vcmpps_avx512vl(auVar129,auVar91,0);
    bVar60 = (byte)uVar20 & bVar55;
    if (bVar60 != 0) {
      uVar130 = (uint)bVar60;
    }
    uVar131 = 0;
    for (; (uVar130 & 1) == 0; uVar130 = uVar130 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    local_8ec = aiStack_138[uVar58 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar55;
    abStack_180[uVar58 * 0x60] = bVar55;
    if (bVar55 == 0) {
      uVar64 = uVar64 - 1;
    }
    uVar138 = (undefined4)uVar63;
    auVar179._4_4_ = uVar138;
    auVar179._0_4_ = uVar138;
    auVar179._8_4_ = uVar138;
    auVar179._12_4_ = uVar138;
    auVar179._16_4_ = uVar138;
    auVar179._20_4_ = uVar138;
    auVar179._24_4_ = uVar138;
    auVar179._28_4_ = uVar138;
    auVar79 = vmovshdup_avx(auVar148);
    auVar79 = vsubps_avx(auVar79,auVar148);
    auVar155._0_4_ = auVar79._0_4_;
    auVar155._4_4_ = auVar155._0_4_;
    auVar155._8_4_ = auVar155._0_4_;
    auVar155._12_4_ = auVar155._0_4_;
    auVar155._16_4_ = auVar155._0_4_;
    auVar155._20_4_ = auVar155._0_4_;
    auVar155._24_4_ = auVar155._0_4_;
    auVar155._28_4_ = auVar155._0_4_;
    auVar79 = vfmadd132ps_fma(auVar155,auVar179,_DAT_01f7b040);
    _local_320 = ZEXT1632(auVar79);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_320 + (ulong)uVar131 * 4);
    uVar58 = (ulong)uVar64;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }